

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraphFlattener::convertInstances
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  Vector *pVVar1;
  undefined1 (*pauVar2) [16];
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 *paVar8;
  float *pfVar9;
  undefined8 uVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  undefined1 auVar12 [16];
  bool bVar13;
  Node *pNVar14;
  size_t sVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  size_t sVar18;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar19;
  Ref<embree::SceneGraph::Node> *pRVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  byte bVar62;
  undefined4 uVar63;
  BBox1f this_00;
  long *plVar64;
  ulong uVar65;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar66;
  runtime_error *prVar67;
  byte bVar69;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong uVar70;
  ulong extraout_RDX_16;
  ulong extraout_RDX_17;
  ulong extraout_RDX_18;
  ulong extraout_RDX_19;
  ulong extraout_RDX_20;
  ulong extraout_RDX_21;
  ulong extraout_RDX_22;
  ulong extraout_RDX_23;
  long lVar71;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  ulong uVar72;
  uint uVar73;
  int iVar74;
  uint uVar75;
  int iVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float local_188;
  float local_178;
  float fStack_174;
  Transformations local_168;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined8 local_128;
  long lStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 local_d8;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_98;
  SceneGraphFlattener *local_90;
  undefined8 local_88;
  float fStack_80;
  float fStack_7c;
  long *local_78;
  Node *local_70;
  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  local_68;
  undefined8 local_48;
  _Base_ptr p_Stack_40;
  undefined7 uVar68;
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  
  pNVar14 = node->ptr;
  local_98 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
              *)group;
  local_90 = this;
  if (pNVar14->closed == true) {
    this_00 = (BBox1f)alignedMalloc(0xa0,0x10);
    local_70 = node->ptr;
    if (local_70 != (Node *)0x0) {
      (*(local_70->super_RefCount)._vptr_RefCount[2])();
    }
    lookupGeometries((SceneGraphFlattener *)&local_68,&local_90->node);
    SceneGraph::TransformNode::TransformNode
              ((TransformNode *)this_00,spaces,(Ref<embree::SceneGraph::Node> *)&local_68);
    local_168.time_range = this_00;
    (**(code **)(*(long *)this_00 + 0x10))(this_00);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
    ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
              (local_98,(Ref<embree::SceneGraph::Node> *)&local_168);
    if (local_168.time_range != (BBox1f)0x0) {
      (**(code **)(*(long *)local_168.time_range + 0x18))();
    }
    if ((Node *)local_68.
                super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                ._M_impl.super__Vector_impl_data._M_start != (Node *)0x0) {
      (*((RefCount *)
        &(local_68.
          super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
          ._M_impl.super__Vector_impl_data._M_start)->time_range)->_vptr_RefCount[3])();
    }
    if (local_70 == (Node *)0x0) {
      return;
    }
    (*(local_70->super_RefCount)._vptr_RefCount[3])();
    return;
  }
  plVar64 = (long *)__dynamic_cast(pNVar14,&SceneGraph::Node::typeinfo,
                                   &SceneGraph::TransformNode::typeinfo,0);
  if (plVar64 == (long *)0x0) {
    plVar64 = (long *)__dynamic_cast(pNVar14,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::MultiTransformNode::typeinfo,0);
    if (plVar64 == (long *)0x0) {
      plVar64 = (long *)__dynamic_cast(pNVar14,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::GroupNode::typeinfo,0);
      if (plVar64 == (long *)0x0) {
        return;
      }
      (**(code **)(*plVar64 + 0x10))(plVar64);
      pRVar20 = (Ref<embree::SceneGraph::Node> *)plVar64[0xe];
      for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar64[0xd]; node_00 != pRVar20;
          node_00 = node_00 + 1) {
        convertInstances(local_90,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                   *)local_98,node_00,spaces);
      }
      (**(code **)(*plVar64 + 0x18))(plVar64);
      return;
    }
    (**(code **)(*plVar64 + 0x10))(plVar64);
    local_68.
    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar71 = plVar64[0xd];
    if (plVar64[0xe] != lVar71) {
      uVar72 = 0;
      uVar70 = extraout_RDX_03;
      local_78 = plVar64;
      do {
        puVar6 = (undefined8 *)(lVar71 + uVar72 * 0x30);
        sVar15 = *(size_t *)(lVar71 + 0x10 + uVar72 * 0x30);
        local_88 = uVar72;
        if (sVar15 == 1) {
          fVar77 = (float)*puVar6;
          fVar79 = (float)((ulong)*puVar6 >> 0x20);
          fVar95 = (spaces->time_range).lower;
          fVar123 = (spaces->time_range).upper;
          uVar73 = -(uint)(fVar77 < fVar95);
          uVar75 = -(uint)(fVar79 < fVar123);
          local_168.time_range =
               (BBox1f)(CONCAT44(~uVar75 & (uint)fVar123,~uVar73 & (uint)fVar77) |
                       CONCAT44((uint)fVar79 & uVar75,(uint)fVar95 & uVar73));
          sVar15 = (spaces->spaces).size_active;
          local_168.spaces.size_active = 0;
          local_168.spaces.size_alloced = 0;
          local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
          if (sVar15 == 0) {
            local_168.quaternion = false;
          }
          else {
            local_168.spaces.items =
                 (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                 alignedMalloc(sVar15 << 6,0x10);
            local_168.quaternion = false;
            local_168.spaces.size_active = sVar15;
            local_168.spaces.size_alloced = sVar15;
            if ((spaces->spaces).size_active != 0) {
              lVar71 = 0x30;
              uVar72 = 0;
              uVar70 = extraout_RDX_04;
              do {
                uVar73 = (uint)uVar70;
                pauVar17 = (undefined1 (*) [16])puVar6[4];
                pAVar66 = (spaces->spaces).items;
                bVar62 = *(byte *)(puVar6 + 5);
                uVar68 = (undefined7)((ulong)local_168.spaces.items >> 8);
                uVar65 = CONCAT71(uVar68,bVar62);
                bVar13 = spaces->quaternion;
                local_168.quaternion = false;
                fVar77 = (float)((ulong)*(undefined8 *)(*pauVar17 + 4) >> 0x20);
                local_188 = (float)*(undefined8 *)(*pauVar17 + 4);
                if (((((*(float *)*pauVar17 != 1.0) || (NAN(*(float *)*pauVar17))) ||
                     (local_188 != 0.0)) || ((NAN(local_188) || (fVar77 != 0.0)))) || (NAN(fVar77)))
                {
LAB_00157823:
                  uVar10 = *(undefined8 *)((long)pAVar66 + lVar71 + -0x30);
                  fVar95 = (float)uVar10;
                  fVar123 = (float)((ulong)uVar10 >> 0x20);
                  iVar74 = -(uint)(fVar95 != 1.0);
                  iVar76 = -(uint)(fVar123 != 0.0);
                  auVar83._4_4_ = iVar76;
                  auVar83._0_4_ = iVar74;
                  auVar83._8_4_ = iVar76;
                  auVar83._12_4_ = iVar76;
                  auVar82._8_8_ = auVar83._8_8_;
                  auVar82._4_4_ = iVar74;
                  auVar82._0_4_ = iVar74;
                  uVar73 = movmskpd(uVar73,auVar82);
                  fVar79 = *(float *)((long)pAVar66 + lVar71 + -0x28);
                  if (((uVar73 & 1) == 0) &&
                     (((bVar69 = (byte)uVar73 >> 1, bVar69 == 0 && (fVar79 == 0.0)) &&
                      (!NAN(fVar79))))) {
                    pfVar3 = (float *)((long)pAVar66 + lVar71 + -0x24);
                    auVar53._4_4_ = -(uint)(pfVar3[1] != 0.0);
                    auVar53._0_4_ = -(uint)(*pfVar3 != 0.0);
                    auVar53._8_4_ = -(uint)(pfVar3[2] != 1.0);
                    auVar53._12_4_ = -(uint)(pfVar3[3] != 0.0);
                    uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar53);
                    if ((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                       (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                      pfVar3 = (float *)((long)pAVar66 + lVar71 + -0x14);
                      auVar54._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar54._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar54._8_4_ = -(uint)(pfVar3[2] != 0.0);
                      auVar54._12_4_ = -(uint)(pfVar3[3] != 1.0);
                      uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar54);
                      if ((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                         (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                        pfVar3 = (float *)((long)pAVar66 + lVar71 + -4);
                        auVar55._4_4_ = -(uint)(pfVar3[1] != 0.0);
                        auVar55._0_4_ = -(uint)(*pfVar3 != 0.0);
                        auVar55._8_4_ = -(uint)(pfVar3[2] != 0.0);
                        auVar55._12_4_ = -(uint)(pfVar3[3] != 0.0);
                        uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar55);
                        if ((((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                             ((uVar73 & 4) == 0)) &&
                            (bVar69 = ((byte)uVar73 & 8) >> 3,
                            uVar70 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 == 0)) &&
                           ((bVar13 == false ||
                            ((fVar78 = *(float *)((long)&(pAVar66->l).vx.field_0 + lVar71 + 0xc),
                             fVar78 == 1.0 && (!NAN(fVar78))))))) {
                          fVar78 = *(float *)*pauVar17;
                          local_188 = *(float *)(*pauVar17 + 4);
                          fVar77 = *(float *)(*pauVar17 + 8);
                          fVar123 = *(float *)(*pauVar17 + 0xc);
                          fVar126 = *(float *)pauVar17[1];
                          fVar109 = *(float *)(pauVar17[1] + 4);
                          fVar98 = *(float *)(pauVar17[1] + 8);
                          fVar119 = *(float *)(pauVar17[1] + 0xc);
                          fVar79 = *(float *)pauVar17[2];
                          fVar95 = *(float *)(pauVar17[2] + 4);
                          fVar92 = *(float *)(pauVar17[2] + 8);
                          fVar105 = *(float *)(pauVar17[2] + 0xc);
                          fVar111 = *(float *)pauVar17[3];
                          fVar124 = *(float *)(pauVar17[3] + 4);
                          fVar125 = *(float *)(pauVar17[3] + 8);
                          fVar104 = *(float *)(pauVar17[3] + 0xc);
                          local_168.quaternion = (bool)bVar62;
                          goto LAB_00157f76;
                        }
                      }
                    }
                  }
                  uVar70 = uVar65 & 0xffffffff;
                  bVar69 = (byte)uVar70 | bVar13;
                  uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
                  if (bVar69 == 0) {
                    fVar125 = *(float *)*pauVar17;
                    fVar127 = *(float *)(*pauVar17 + 4);
                    fVar133 = *(float *)(*pauVar17 + 8);
                    fVar136 = *(float *)(*pauVar17 + 0xc);
                    fVar93 = *(float *)pauVar17[1];
                    fVar94 = *(float *)(pauVar17[1] + 4);
                    fVar99 = *(float *)(pauVar17[1] + 8);
                    fVar129 = *(float *)(pauVar17[1] + 0xc);
                    fVar100 = *(float *)pauVar17[2];
                    fVar101 = *(float *)(pauVar17[2] + 4);
                    fVar134 = *(float *)(pauVar17[2] + 8);
                    fVar102 = *(float *)(pauVar17[2] + 0xc);
                    fVar78 = fVar95 * fVar125 + fVar123 * fVar93 + fVar79 * fVar100;
                    local_188 = fVar95 * fVar127 + fVar123 * fVar94 + fVar79 * fVar101;
                    fVar77 = fVar95 * fVar133 + fVar123 * fVar99 + fVar79 * fVar134;
                    fVar123 = fVar95 * fVar136 + fVar123 * fVar129 + fVar79 * fVar102;
                    fVar79 = *(float *)((long)pAVar66 + lVar71 + -0x20);
                    fVar95 = *(float *)((long)pAVar66 + lVar71 + -0x1c);
                    fVar119 = *(float *)((long)pAVar66 + lVar71 + -0x18);
                    fVar105 = *(float *)((long)pAVar66 + lVar71 + -0x10);
                    fVar126 = fVar79 * fVar125 + fVar95 * fVar93 + fVar119 * fVar100;
                    fVar109 = fVar79 * fVar127 + fVar95 * fVar94 + fVar119 * fVar101;
                    fVar98 = fVar79 * fVar133 + fVar95 * fVar99 + fVar119 * fVar134;
                    fVar119 = fVar79 * fVar136 + fVar95 * fVar129 + fVar119 * fVar102;
                    fVar111 = *(float *)((long)pAVar66 + lVar71 + -0xc);
                    fVar124 = *(float *)((long)pAVar66 + lVar71 + -8);
                    fVar79 = fVar105 * fVar125 + fVar111 * fVar93 + fVar124 * fVar100;
                    fVar95 = fVar105 * fVar127 + fVar111 * fVar94 + fVar124 * fVar101;
                    fVar92 = fVar105 * fVar133 + fVar111 * fVar99 + fVar124 * fVar134;
                    fVar105 = fVar105 * fVar136 + fVar111 * fVar129 + fVar124 * fVar102;
                    fVar104 = *(float *)((long)&(pAVar66->l).vx.field_0 + lVar71);
                    fVar97 = *(float *)((long)&(pAVar66->l).vx.field_0 + lVar71 + 4);
                    fVar96 = *(float *)((long)&(pAVar66->l).vx.field_0 + lVar71 + 8);
                    fVar111 = fVar104 * fVar125 + fVar97 * fVar93 + fVar96 * fVar100 +
                              *(float *)pauVar17[3];
                    fVar124 = fVar104 * fVar127 + fVar97 * fVar94 + fVar96 * fVar101 +
                              *(float *)(pauVar17[3] + 4);
                    fVar125 = fVar104 * fVar133 + fVar97 * fVar99 + fVar96 * fVar134 +
                              *(float *)(pauVar17[3] + 8);
                    fVar104 = fVar104 * fVar136 + fVar97 * fVar129 + fVar96 * fVar102 +
                              *(float *)(pauVar17[3] + 0xc);
                  }
                  else {
                    uVar65 = uVar65 & 0xffffffff;
                    bVar69 = (byte)uVar65 & bVar13;
                    uVar70 = CONCAT71((int7)(uVar65 >> 8),bVar69);
                    if (bVar69 == 1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                      std::ostream::put(-0x28);
                      std::ostream::flush();
                      fVar77 = *(float *)(pauVar17[3] + 0xc);
                      fVar79 = *(float *)(*pauVar17 + 0xc);
                      fVar95 = *(float *)(pauVar17[1] + 0xc);
                      fVar123 = *(float *)(pauVar17[2] + 0xc);
                      auVar12 = *pauVar17;
                      fVar78 = *(float *)pauVar17[1];
                      fVar126 = *(float *)(pauVar17[1] + 4);
                      fVar109 = *(float *)pauVar17[2];
                      fVar98 = *(float *)(pauVar17[2] + 4);
                      fVar119 = *(float *)(pauVar17[2] + 8);
                      fVar127 = fVar79 * fVar95 + fVar77 * fVar123;
                      fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                      fVar111 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 +
                                -fVar123 * fVar123;
                      fVar124 = fVar77 * fVar77 - fVar79 * fVar79;
                      fVar125 = fVar95 * fVar95 + fVar124 + -fVar123 * fVar123;
                      fVar136 = fVar79 * fVar123 - fVar77 * fVar95;
                      fVar92 = fVar77 * fVar95 + fVar79 * fVar123;
                      fVar133 = fVar95 * fVar123 + fVar77 * fVar79;
                      fVar77 = fVar95 * fVar123 - fVar77 * fVar79;
                      fVar104 = *(float *)pauVar17[3];
                      fVar97 = *(float *)(pauVar17[3] + 4);
                      fVar96 = *(float *)(pauVar17[3] + 8);
                      fVar127 = fVar127 + fVar127;
                      fVar136 = fVar136 + fVar136;
                      fVar105 = fVar105 + fVar105;
                      fVar133 = fVar133 + fVar133;
                      fVar92 = fVar92 + fVar92;
                      fVar77 = fVar77 + fVar77;
                      fVar79 = fVar123 * fVar123 + fVar124 + -fVar95 * fVar95;
                      fVar112 = fVar111 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                      fVar114 = fVar111 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                      fVar116 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                      fVar118 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                      fVar106 = fVar105 * 1.0 + fVar125 * 0.0 + fVar133 * 0.0;
                      fVar107 = fVar105 * 0.0 + fVar125 * 1.0 + fVar133 * 0.0;
                      fVar108 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 1.0;
                      fVar110 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 0.0;
                      fVar111 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                      fVar124 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                      fVar125 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                      fVar93 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                      local_178 = auVar12._4_4_;
                      fStack_174 = auVar12._8_4_;
                      local_188 = auVar12._0_4_;
                      fVar128 = local_188 * fVar112 + fVar106 * 0.0 + fVar111 * 0.0;
                      fVar130 = local_188 * fVar114 + fVar107 * 0.0 + fVar124 * 0.0;
                      fVar131 = local_188 * fVar116 + fVar108 * 0.0 + fVar125 * 0.0;
                      fVar132 = local_188 * fVar118 + fVar110 * 0.0 + fVar93 * 0.0;
                      fVar127 = fVar78 * fVar112 + fVar126 * fVar106 + fVar111 * 0.0;
                      fVar133 = fVar78 * fVar114 + fVar126 * fVar107 + fVar124 * 0.0;
                      fVar136 = fVar78 * fVar116 + fVar126 * fVar108 + fVar125 * 0.0;
                      fVar94 = fVar78 * fVar118 + fVar126 * fVar110 + fVar93 * 0.0;
                      local_138 = fVar109 * fVar112 + fVar98 * fVar106 + fVar119 * fVar111;
                      fStack_134 = fVar109 * fVar114 + fVar98 * fVar107 + fVar119 * fVar124;
                      fStack_130 = fVar109 * fVar116 + fVar98 * fVar108 + fVar119 * fVar125;
                      fStack_12c = fVar109 * fVar118 + fVar98 * fVar110 + fVar119 * fVar93;
                      fVar77 = *(float *)((long)&(pAVar66->l).vx.field_0 + lVar71 + 0xc);
                      fVar79 = *(float *)((long)pAVar66 + lVar71 + -0x24);
                      fVar95 = *(float *)((long)pAVar66 + lVar71 + -0x14);
                      fVar123 = *(float *)((long)pAVar66 + lVar71 + -4);
                      fVar129 = fVar79 * fVar95 + fVar77 * fVar123;
                      fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                      fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 +
                               -fVar123 * fVar123;
                      fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                      fVar135 = fVar95 * fVar95 + fVar126 + -fVar123 * fVar123;
                      fVar134 = fVar79 * fVar123 - fVar77 * fVar95;
                      fVar102 = fVar77 * fVar95 + fVar79 * fVar123;
                      fVar137 = fVar95 * fVar123 + fVar77 * fVar79;
                      fVar92 = fVar95 * fVar123 - fVar77 * fVar79;
                      pfVar4 = (float *)((long)pAVar66 + lVar71 + -0x30);
                      fVar77 = *pfVar4;
                      pfVar5 = (float *)((long)pAVar66 + lVar71 + -0x20);
                      fVar79 = *pfVar5;
                      fVar78 = pfVar5[1];
                      fVar120 = fVar123 * fVar123 + fVar126 + -fVar95 * fVar95;
                      pfVar3 = (float *)((long)pAVar66 + lVar71 + -0x10);
                      fVar95 = *pfVar3;
                      fVar123 = pfVar3[1];
                      fVar126 = pfVar3[2];
                      fVar129 = fVar129 + fVar129;
                      fVar134 = fVar134 + fVar134;
                      pfVar3 = (float *)((long)&(pAVar66->l).vx.field_0 + lVar71);
                      fVar109 = *pfVar3;
                      fVar98 = pfVar3[1];
                      fVar119 = pfVar3[2];
                      fVar100 = fVar99 * 1.0 + fVar129 * 0.0 + fVar134 * 0.0;
                      fVar101 = fVar99 * 0.0 + fVar129 * 1.0 + fVar134 * 0.0;
                      fVar134 = fVar99 * 0.0 + fVar129 * 0.0 + fVar134 * 1.0;
                      fVar105 = fVar105 + fVar105;
                      fVar137 = fVar137 + fVar137;
                      fVar102 = fVar102 + fVar102;
                      fVar92 = fVar92 + fVar92;
                      fVar99 = fVar105 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                      fVar129 = fVar105 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                      fVar105 = fVar105 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                      fVar135 = fVar102 * 1.0 + fVar92 * 0.0 + fVar120 * 0.0;
                      fVar137 = fVar102 * 0.0 + fVar92 * 1.0 + fVar120 * 0.0;
                      fVar92 = fVar102 * 0.0 + fVar92 * 0.0 + fVar120 * 1.0;
                      fVar113 = fVar77 * fVar100 + fVar99 * 0.0 + fVar135 * 0.0;
                      fVar115 = fVar77 * fVar101 + fVar129 * 0.0 + fVar137 * 0.0;
                      fVar117 = fVar77 * fVar134 + fVar105 * 0.0 + fVar92 * 0.0;
                      fVar102 = fVar79 * fVar100 + fVar78 * fVar99 + fVar135 * 0.0;
                      fVar120 = fVar79 * fVar101 + fVar78 * fVar129 + fVar137 * 0.0;
                      fVar103 = fVar79 * fVar134 + fVar78 * fVar105 + fVar92 * 0.0;
                      fVar121 = fVar95 * fVar100 + fVar123 * fVar99 + fVar126 * fVar135;
                      fVar122 = fVar95 * fVar101 + fVar123 * fVar129 + fVar126 * fVar137;
                      fVar123 = fVar95 * fVar134 + fVar123 * fVar105 + fVar126 * fVar92;
                      fVar126 = fVar109 * fVar100 + fVar98 * fVar99 + fVar119 * fVar135 +
                                pfVar4[1] + 0.0;
                      fVar99 = fVar109 * fVar101 + fVar98 * fVar129 + fVar119 * fVar137 +
                               pfVar4[2] + 0.0;
                      fVar109 = fVar109 * fVar134 + fVar98 * fVar105 + fVar119 * fVar92 +
                                pfVar5[2] + 0.0;
                      fVar78 = fVar113 * fVar128 + fVar115 * fVar127 + fVar117 * local_138;
                      local_188 = fVar113 * fVar130 + fVar115 * fVar133 + fVar117 * fStack_134;
                      fVar77 = fVar113 * fVar131 + fVar115 * fVar136 + fVar117 * fStack_130;
                      fVar79 = fVar121 * fVar128 + fVar122 * fVar127 + fVar123 * local_138;
                      fVar95 = fVar121 * fVar130 + fVar122 * fVar133 + fVar123 * fStack_134;
                      fVar92 = fVar121 * fVar131 + fVar122 * fVar136 + fVar123 * fStack_130;
                      uVar70 = extraout_RDX_05;
                      fVar105 = fVar121 * fVar132 + fVar122 * fVar94 + fVar123 * fStack_12c;
                      fVar123 = fVar113 * fVar132 + fVar115 * fVar94 + fVar117 * fStack_12c;
                      fVar111 = fVar126 * fVar128 + fVar99 * fVar127 + fVar109 * local_138 +
                                fVar104 * fVar112 + fVar97 * fVar106 + fVar96 * fVar111 +
                                local_178 + 0.0;
                      fVar124 = fVar126 * fVar130 + fVar99 * fVar133 + fVar109 * fStack_134 +
                                fVar104 * fVar114 + fVar97 * fVar107 + fVar96 * fVar124 +
                                fStack_174 + 0.0;
                      fVar125 = fVar126 * fVar131 + fVar99 * fVar136 + fVar109 * fStack_130 +
                                fVar104 * fVar116 + fVar97 * fVar108 + fVar96 * fVar125 +
                                *(float *)(pauVar17[1] + 8) + 0.0;
                      fVar104 = fVar126 * fVar132 + fVar99 * fVar94 + fVar109 * fStack_12c +
                                fVar104 * fVar118 + fVar97 * fVar110 + fVar96 * fVar93 + 0.0;
                      fVar126 = fVar102 * fVar128 + fVar120 * fVar127 + fVar103 * local_138;
                      fVar109 = fVar102 * fVar130 + fVar120 * fVar133 + fVar103 * fStack_134;
                      fVar98 = fVar102 * fVar131 + fVar120 * fVar136 + fVar103 * fStack_130;
                      fVar119 = fVar102 * fVar132 + fVar120 * fVar94 + fVar103 * fStack_12c;
                    }
                    else {
                      bVar62 = bVar62 ^ 1 | bVar13;
                      if (bVar62 == 0) {
                        local_f8 = ZEXT416(*(uint *)(pauVar17[3] + 0xc));
                        local_d8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                    )ZEXT416(*(uint *)(*pauVar17 + 0xc));
                        local_c8 = ZEXT416(*(uint *)(pauVar17[1] + 0xc));
                        local_108 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                     )ZEXT416(*(uint *)(pauVar17[2] + 0xc));
                        pauVar2 = pauVar17 + 1;
                        fVar111 = *(float *)*pauVar2;
                        fVar124 = *(float *)(pauVar17[1] + 4);
                        local_128 = *(undefined8 *)*pauVar2;
                        fVar125 = *(float *)(pauVar17[1] + 0xc);
                        local_e8 = *pauVar2;
                        local_118 = *(float *)pauVar17[2];
                        fStack_114 = *(float *)(pauVar17[2] + 4);
                        fStack_110 = *(float *)(pauVar17[2] + 8);
                        fStack_10c = *(float *)(pauVar17[2] + 0xc);
                        local_a8._0_4_ = *(undefined4 *)*pauVar17;
                        fStack_9c = *(float *)(*pauVar17 + 4);
                        pfVar3 = (float *)((long)pAVar66 + lVar71 + -0x30);
                        fVar79 = *pfVar3;
                        fVar95 = pfVar3[1];
                        fVar123 = pfVar3[2];
                        pfVar3 = (float *)((long)pAVar66 + lVar71 + -0x20);
                        fVar126 = *pfVar3;
                        fVar109 = pfVar3[1];
                        fVar98 = pfVar3[2];
                        puVar7 = (undefined8 *)((long)pAVar66 + lVar71 + -0x10);
                        local_48 = (_Base_ptr)*puVar7;
                        p_Stack_40 = (_Base_ptr)puVar7[1];
                        pfVar3 = (float *)((long)&(pAVar66->l).vx.field_0 + lVar71);
                        fVar119 = *pfVar3;
                        fVar92 = pfVar3[1];
                        fVar105 = pfVar3[2];
                        fVar78 = fVar79 * (float)local_a8._0_4_ +
                                 fVar95 * fVar111 + fVar123 * local_118;
                        fVar104 = fVar79 * 0.0 + fVar95 * fVar124 + fVar123 * fStack_114;
                        fVar79 = fVar79 * 0.0 + fVar95 * 0.0 + fVar123 * fStack_110;
                        local_138 = fVar126 * (float)local_a8._0_4_ +
                                    fVar109 * fVar111 + fVar98 * local_118;
                        fStack_134 = fVar126 * 0.0 + fVar109 * fVar124 + fVar98 * fStack_114;
                        fStack_130 = fVar126 * 0.0 + fVar109 * 0.0 + fVar98 * fStack_110;
                        fStack_12c = fVar126 * fStack_9c + fVar109 * fVar125 + fVar98 * fStack_10c;
                        lStack_120 = (ulong)(uint)fVar125 << 0x20;
                        stack0xffffffffffffff5c = 0;
                        local_b8._0_4_ =
                             fVar119 * (float)local_a8._0_4_ +
                             fVar92 * fVar111 + fVar105 * local_118 + *(float *)pauVar17[3];
                        local_b8._4_4_ =
                             fVar119 * 0.0 + fVar92 * fVar124 + fVar105 * fStack_114 +
                             *(float *)(pauVar17[3] + 4);
                        fStack_b0 = fVar119 * 0.0 + fVar92 * 0.0 + fVar105 * fStack_110 +
                                    *(float *)(pauVar17[3] + 8);
                        register0x0000128c =
                             fVar119 * fStack_9c + fVar92 * fVar125 + fVar105 * fStack_10c +
                             *(float *)(pauVar17[3] + 0xc);
                        if (((fVar104 != 0.0) || (NAN(fVar104))) ||
                           ((fVar79 != 0.0 ||
                            (((NAN(fVar79) || (fStack_130 != 0.0)) || (NAN(fStack_130))))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                          std::ostream::put(-0x28);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_07;
                        }
                        fVar79 = (float)local_a8._0_4_ * (float)local_48 +
                                 (float)local_128 * local_48._4_4_ + local_118 * p_Stack_40._0_4_;
                        fVar95 = (float)local_a8._4_4_ * (float)local_48 +
                                 local_128._4_4_ * local_48._4_4_ + fStack_114 * p_Stack_40._0_4_;
                        fVar92 = fStack_a0 * (float)local_48 +
                                 (float)lStack_120 * local_48._4_4_ + fStack_110 * p_Stack_40._0_4_;
                        local_168.quaternion = true;
                        fVar105 = local_108.x;
                        fVar123 = local_d8.x;
                        fVar111 = (float)local_b8._0_4_;
                        fVar124 = (float)local_b8._4_4_;
                        fVar125 = fStack_b0;
                        fVar104 = (float)local_f8._0_4_;
                        fVar126 = local_138;
                        fVar109 = fStack_134;
                        fVar98 = (float)local_e8._8_4_;
                        fVar119 = (float)local_c8._0_4_;
                      }
                      else {
                        if (((local_188 != 0.0) || (NAN(local_188))) ||
                           ((fVar77 != 0.0 ||
                            ((NAN(fVar77) ||
                             (auVar36._4_4_ = -(uint)(*(float *)pauVar17[1] != 0.0),
                             auVar36._0_4_ = -(uint)(*(float *)(pauVar17[1] + 8) != 0.0),
                             auVar36._8_4_ = -(uint)((float)*(undefined8 *)pauVar17[2] != 0.0),
                             auVar36._12_4_ =
                                  -(uint)((float)((ulong)*(undefined8 *)pauVar17[2] >> 0x20) != 0.0)
                             , uVar63 = movmskps((int)CONCAT71(uVar68,bVar62),auVar36),
                             (char)uVar63 != '\0')))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                          std::ostream::put(-0x28);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_06;
                        }
                        pfVar4 = (float *)((long)pAVar66 + lVar71 + -0x30);
                        pfVar5 = (float *)((long)pAVar66 + lVar71 + -0x20);
                        pfVar9 = (float *)((long)pAVar66 + lVar71 + -0x10);
                        fVar79 = *pfVar9;
                        fVar95 = pfVar9[1];
                        pfVar3 = (float *)((long)&(pAVar66->l).vx.field_0 + lVar71);
                        fVar78 = *(float *)*pauVar17 * *pfVar4;
                        local_188 = pfVar4[1] + (float)*(undefined8 *)pauVar17[3];
                        fVar77 = pfVar4[2] + (float)((ulong)*(undefined8 *)pauVar17[3] >> 0x20);
                        fVar92 = pfVar9[2] * *(float *)(pauVar17[2] + 8);
                        local_168.quaternion = true;
                        fVar105 = pfVar9[3];
                        fVar123 = pfVar4[3];
                        fVar111 = *pfVar3;
                        fVar124 = pfVar3[1];
                        fVar125 = pfVar3[2];
                        fVar104 = pfVar3[3];
                        fVar126 = *pfVar5;
                        fVar109 = pfVar5[1] * *(float *)(pauVar17[1] + 4);
                        fVar98 = pfVar5[2] + *(float *)(pauVar17[3] + 8);
                        fVar119 = pfVar5[3];
                      }
                    }
                  }
                }
                else {
                  auVar33._4_4_ = -(uint)(*(float *)pauVar17[1] != 0.0);
                  auVar33._0_4_ = -(uint)(*(float *)(*pauVar17 + 0xc) != 0.0);
                  auVar33._8_4_ = -(uint)(*(float *)(pauVar17[1] + 4) != 1.0);
                  auVar33._12_4_ = -(uint)(*(float *)(pauVar17[1] + 8) != 0.0);
                  uVar73 = movmskps(uVar73,auVar33);
                  if ((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                     (((uVar73 & 4) != 0 ||
                      (bVar69 = ((byte)uVar73 & 8) >> 3,
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 != 0))))
                  goto LAB_00157823;
                  auVar34._4_4_ = -(uint)(*(float *)pauVar17[2] != 0.0);
                  auVar34._0_4_ = -(uint)(*(float *)(pauVar17[1] + 0xc) != 0.0);
                  auVar34._8_4_ = -(uint)(*(float *)(pauVar17[2] + 4) != 0.0);
                  auVar34._12_4_ = -(uint)(*(float *)(pauVar17[2] + 8) != 1.0);
                  uVar73 = movmskps(uVar73,auVar34);
                  if (((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                      ((uVar73 & 4) != 0)) ||
                     (bVar69 = ((byte)uVar73 & 8) >> 3,
                     uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 != 0)) goto LAB_00157823;
                  auVar35._4_4_ = -(uint)(*(float *)pauVar17[3] != 0.0);
                  auVar35._0_4_ = -(uint)(*(float *)(pauVar17[2] + 0xc) != 0.0);
                  auVar35._8_4_ = -(uint)(*(float *)(pauVar17[3] + 4) != 0.0);
                  auVar35._12_4_ = -(uint)(*(float *)(pauVar17[3] + 8) != 0.0);
                  uVar73 = movmskps(uVar73,auVar35);
                  if ((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0)
                     ) goto LAB_00157823;
                  bVar69 = ((byte)uVar73 & 8) >> 3;
                  uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69);
                  uVar70 = (ulong)uVar73;
                  if ((bVar69 != 0) ||
                     ((bVar62 != 0 &&
                      ((*(float *)(pauVar17[3] + 0xc) != 1.0 || (NAN(*(float *)(pauVar17[3] + 0xc)))
                       ))))) goto LAB_00157823;
                  pfVar3 = (float *)((long)pAVar66 + lVar71 + -0x30);
                  fVar78 = *pfVar3;
                  local_188 = pfVar3[1];
                  fVar77 = pfVar3[2];
                  fVar123 = pfVar3[3];
                  pfVar3 = (float *)((long)pAVar66 + lVar71 + -0x20);
                  fVar126 = *pfVar3;
                  fVar109 = pfVar3[1];
                  fVar98 = pfVar3[2];
                  fVar119 = pfVar3[3];
                  pfVar3 = (float *)((long)pAVar66 + lVar71 + -0x10);
                  fVar79 = *pfVar3;
                  fVar95 = pfVar3[1];
                  fVar92 = pfVar3[2];
                  fVar105 = pfVar3[3];
                  pfVar3 = (float *)((long)&(pAVar66->l).vx.field_0 + lVar71);
                  fVar111 = *pfVar3;
                  fVar124 = pfVar3[1];
                  fVar125 = pfVar3[2];
                  fVar104 = pfVar3[3];
                  local_168.quaternion = bVar13;
                }
LAB_00157f76:
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x30);
                *pfVar3 = fVar78;
                pfVar3[1] = local_188;
                pfVar3[2] = fVar77;
                pfVar3[3] = fVar123;
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x20);
                *pfVar3 = fVar126;
                pfVar3[1] = fVar109;
                pfVar3[2] = fVar98;
                pfVar3[3] = fVar119;
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x10);
                *pfVar3 = fVar79;
                pfVar3[1] = fVar95;
                pfVar3[2] = fVar92;
                pfVar3[3] = fVar105;
                pfVar3 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar71);
                *pfVar3 = fVar111;
                pfVar3[1] = fVar124;
                pfVar3[2] = fVar125;
                pfVar3[3] = fVar104;
                uVar72 = uVar72 + 1;
                lVar71 = lVar71 + 0x40;
              } while (uVar72 < (spaces->spaces).size_active);
            }
          }
        }
        else {
          sVar18 = (spaces->spaces).size_active;
          if (sVar18 == 1) {
            fVar77 = (float)*puVar6;
            fVar79 = (float)((ulong)*puVar6 >> 0x20);
            fVar95 = (spaces->time_range).lower;
            fVar123 = (spaces->time_range).upper;
            uVar73 = -(uint)(fVar77 < fVar95);
            uVar75 = -(uint)(fVar79 < fVar123);
            local_168.time_range =
                 (BBox1f)(CONCAT44(~uVar75 & (uint)fVar123,~uVar73 & (uint)fVar77) |
                         CONCAT44((uint)fVar79 & uVar75,(uint)fVar95 & uVar73));
            local_168.spaces.size_active = 0;
            local_168.spaces.size_alloced = 0;
            local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar15 != 0) {
              local_168.spaces.items =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                   alignedMalloc(sVar15 << 6,0x10);
              uVar70 = extraout_RDX_08;
              local_168.spaces.size_alloced = sVar15;
            }
            pAVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (*(char *)(puVar6 + 5) == '\0') {
              pAVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        (ulong)*(uint *)&spaces->quaternion;
            }
            local_168.quaternion = SUB81(pAVar66,0);
            local_168.spaces.size_active = local_168.spaces.size_alloced;
            if (puVar6[2] != 0) {
              lVar71 = 0x30;
              uVar72 = 0;
              do {
                uVar73 = (uint)uVar70;
                lVar16 = puVar6[4];
                pAVar19 = (spaces->spaces).items;
                bVar62 = *(byte *)(puVar6 + 5);
                uVar68 = (undefined7)((ulong)pAVar66 >> 8);
                uVar65 = CONCAT71(uVar68,bVar62);
                bVar13 = spaces->quaternion;
                local_168.quaternion = false;
                fVar77 = *(float *)(lVar16 + -0x30 + lVar71);
                uVar10 = *(undefined8 *)(lVar16 + -0x2c + lVar71);
                fVar79 = (float)((ulong)uVar10 >> 0x20);
                local_188 = (float)uVar10;
                if ((((fVar77 != 1.0) || (NAN(fVar77))) || (local_188 != 0.0)) ||
                   (((NAN(local_188) || (fVar79 != 0.0)) || (NAN(fVar79))))) {
LAB_00158508:
                  uVar10 = *(undefined8 *)&(pAVar19->l).vx.field_0;
                  fVar95 = (float)uVar10;
                  fVar123 = (float)((ulong)uVar10 >> 0x20);
                  iVar74 = -(uint)(fVar95 != 1.0);
                  iVar76 = -(uint)(fVar123 != 0.0);
                  auVar85._4_4_ = iVar76;
                  auVar85._0_4_ = iVar74;
                  auVar85._8_4_ = iVar76;
                  auVar85._12_4_ = iVar76;
                  auVar84._8_8_ = auVar85._8_8_;
                  auVar84._4_4_ = iVar74;
                  auVar84._0_4_ = iVar74;
                  uVar73 = movmskpd(uVar73,auVar84);
                  fVar77 = (pAVar19->l).vx.field_0.m128[2];
                  if (((uVar73 & 1) == 0) &&
                     (((bVar69 = (byte)uVar73 >> 1, bVar69 == 0 && (fVar77 == 0.0)) &&
                      (!NAN(fVar77))))) {
                    auVar56._4_4_ = -(uint)((pAVar19->l).vy.field_0.m128[0] != 0.0);
                    auVar56._0_4_ = -(uint)((pAVar19->l).vx.field_0.m128[3] != 0.0);
                    auVar56._8_4_ = -(uint)((pAVar19->l).vy.field_0.m128[1] != 1.0);
                    auVar56._12_4_ = -(uint)((pAVar19->l).vy.field_0.m128[2] != 0.0);
                    uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar56);
                    if ((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                       (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                      auVar57._4_4_ = -(uint)((pAVar19->l).vz.field_0.m128[0] != 0.0);
                      auVar57._0_4_ = -(uint)((pAVar19->l).vy.field_0.m128[3] != 0.0);
                      auVar57._8_4_ = -(uint)((pAVar19->l).vz.field_0.m128[1] != 0.0);
                      auVar57._12_4_ = -(uint)((pAVar19->l).vz.field_0.m128[2] != 1.0);
                      uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar57);
                      if ((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                         (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                        auVar58._4_4_ = -(uint)((pAVar19->p).field_0.m128[0] != 0.0);
                        auVar58._0_4_ = -(uint)((pAVar19->l).vz.field_0.m128[3] != 0.0);
                        auVar58._8_4_ = -(uint)((pAVar19->p).field_0.m128[1] != 0.0);
                        auVar58._12_4_ = -(uint)((pAVar19->p).field_0.m128[2] != 0.0);
                        uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar58);
                        if ((((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                             ((uVar73 & 4) == 0)) &&
                            (bVar69 = ((byte)uVar73 & 8) >> 3,
                            uVar70 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 == 0)) &&
                           ((bVar13 == false ||
                            ((fVar78 = (pAVar19->p).field_0.m128[3], fVar78 == 1.0 && (!NAN(fVar78))
                             ))))) {
                          pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                          fVar78 = *pfVar3;
                          local_188 = pfVar3[1];
                          fVar79 = pfVar3[2];
                          fVar123 = pfVar3[3];
                          pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
                          fVar126 = *pfVar3;
                          fVar109 = pfVar3[1];
                          fVar98 = pfVar3[2];
                          fVar119 = pfVar3[3];
                          pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
                          fVar77 = *pfVar3;
                          fVar95 = pfVar3[1];
                          fVar92 = pfVar3[2];
                          fVar105 = pfVar3[3];
                          pfVar3 = (float *)(lVar16 + lVar71);
                          fVar111 = *pfVar3;
                          fVar124 = pfVar3[1];
                          fVar125 = pfVar3[2];
                          fVar104 = pfVar3[3];
                          local_168.quaternion = (bool)bVar62;
                          goto LAB_00158c50;
                        }
                      }
                    }
                  }
                  uVar70 = uVar65 & 0xffffffff;
                  bVar69 = (byte)uVar70 | bVar13;
                  uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
                  if (bVar69 == 0) {
                    pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                    fVar125 = *pfVar3;
                    fVar127 = pfVar3[1];
                    fVar133 = pfVar3[2];
                    fVar136 = pfVar3[3];
                    pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
                    fVar93 = *pfVar3;
                    fVar94 = pfVar3[1];
                    fVar99 = pfVar3[2];
                    fVar129 = pfVar3[3];
                    pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
                    fVar100 = *pfVar3;
                    fVar101 = pfVar3[1];
                    fVar134 = pfVar3[2];
                    fVar102 = pfVar3[3];
                    fVar78 = fVar95 * fVar125 + fVar123 * fVar93 + fVar77 * fVar100;
                    local_188 = fVar95 * fVar127 + fVar123 * fVar94 + fVar77 * fVar101;
                    fVar79 = fVar95 * fVar133 + fVar123 * fVar99 + fVar77 * fVar134;
                    fVar123 = fVar95 * fVar136 + fVar123 * fVar129 + fVar77 * fVar102;
                    fVar77 = (pAVar19->l).vy.field_0.m128[0];
                    fVar95 = (pAVar19->l).vy.field_0.m128[1];
                    fVar119 = (pAVar19->l).vy.field_0.m128[2];
                    fVar105 = (pAVar19->l).vz.field_0.m128[0];
                    fVar126 = fVar77 * fVar125 + fVar95 * fVar93 + fVar119 * fVar100;
                    fVar109 = fVar77 * fVar127 + fVar95 * fVar94 + fVar119 * fVar101;
                    fVar98 = fVar77 * fVar133 + fVar95 * fVar99 + fVar119 * fVar134;
                    fVar119 = fVar77 * fVar136 + fVar95 * fVar129 + fVar119 * fVar102;
                    fVar111 = (pAVar19->l).vz.field_0.m128[1];
                    fVar124 = (pAVar19->l).vz.field_0.m128[2];
                    fVar77 = fVar105 * fVar125 + fVar111 * fVar93 + fVar124 * fVar100;
                    fVar95 = fVar105 * fVar127 + fVar111 * fVar94 + fVar124 * fVar101;
                    fVar92 = fVar105 * fVar133 + fVar111 * fVar99 + fVar124 * fVar134;
                    fVar105 = fVar105 * fVar136 + fVar111 * fVar129 + fVar124 * fVar102;
                    fVar104 = (pAVar19->p).field_0.m128[0];
                    fVar97 = (pAVar19->p).field_0.m128[1];
                    fVar96 = (pAVar19->p).field_0.m128[2];
                    pfVar3 = (float *)(lVar16 + lVar71);
                    fVar111 = fVar104 * fVar125 + fVar97 * fVar93 + fVar96 * fVar100 + *pfVar3;
                    fVar124 = fVar104 * fVar127 + fVar97 * fVar94 + fVar96 * fVar101 + pfVar3[1];
                    fVar125 = fVar104 * fVar133 + fVar97 * fVar99 + fVar96 * fVar134 + pfVar3[2];
                    fVar104 = fVar104 * fVar136 + fVar97 * fVar129 + fVar96 * fVar102 + pfVar3[3];
                  }
                  else {
                    uVar65 = uVar65 & 0xffffffff;
                    bVar69 = (byte)uVar65 & bVar13;
                    uVar70 = CONCAT71((int7)(uVar65 >> 8),bVar69);
                    if (bVar69 == 1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                      std::ostream::put(-0x28);
                      std::ostream::flush();
                      fVar77 = *(float *)(lVar16 + 0xc + lVar71);
                      fVar79 = *(float *)(lVar16 + -0x24 + lVar71);
                      fVar95 = *(float *)(lVar16 + -0x14 + lVar71);
                      fVar123 = *(float *)(lVar16 + -4 + lVar71);
                      auVar12 = *(undefined1 (*) [16])(lVar16 + -0x30 + lVar71);
                      pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
                      fVar78 = *pfVar3;
                      fVar126 = pfVar3[1];
                      pfVar4 = (float *)(lVar16 + -0x10 + lVar71);
                      fVar109 = *pfVar4;
                      fVar98 = pfVar4[1];
                      fVar119 = pfVar4[2];
                      fVar127 = fVar79 * fVar95 + fVar77 * fVar123;
                      fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                      fVar111 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 +
                                -fVar123 * fVar123;
                      fVar124 = fVar77 * fVar77 - fVar79 * fVar79;
                      fVar125 = fVar95 * fVar95 + fVar124 + -fVar123 * fVar123;
                      fVar136 = fVar79 * fVar123 - fVar77 * fVar95;
                      fVar92 = fVar77 * fVar95 + fVar79 * fVar123;
                      fVar133 = fVar95 * fVar123 + fVar77 * fVar79;
                      fVar77 = fVar95 * fVar123 - fVar77 * fVar79;
                      pfVar4 = (float *)(lVar16 + lVar71);
                      fVar104 = *pfVar4;
                      fVar97 = pfVar4[1];
                      fVar96 = pfVar4[2];
                      fVar127 = fVar127 + fVar127;
                      fVar136 = fVar136 + fVar136;
                      fVar105 = fVar105 + fVar105;
                      fVar133 = fVar133 + fVar133;
                      fVar92 = fVar92 + fVar92;
                      fVar77 = fVar77 + fVar77;
                      fVar79 = fVar123 * fVar123 + fVar124 + -fVar95 * fVar95;
                      fVar112 = fVar111 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                      fVar114 = fVar111 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                      fVar116 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                      fVar118 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                      fVar106 = fVar105 * 1.0 + fVar125 * 0.0 + fVar133 * 0.0;
                      fVar107 = fVar105 * 0.0 + fVar125 * 1.0 + fVar133 * 0.0;
                      fVar108 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 1.0;
                      fVar110 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 0.0;
                      fVar111 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                      fVar124 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                      fVar125 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                      fVar93 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                      local_178 = auVar12._4_4_;
                      fStack_174 = auVar12._8_4_;
                      local_188 = auVar12._0_4_;
                      fVar128 = local_188 * fVar112 + fVar106 * 0.0 + fVar111 * 0.0;
                      fVar130 = local_188 * fVar114 + fVar107 * 0.0 + fVar124 * 0.0;
                      fVar131 = local_188 * fVar116 + fVar108 * 0.0 + fVar125 * 0.0;
                      fVar132 = local_188 * fVar118 + fVar110 * 0.0 + fVar93 * 0.0;
                      fVar127 = fVar78 * fVar112 + fVar126 * fVar106 + fVar111 * 0.0;
                      fVar133 = fVar78 * fVar114 + fVar126 * fVar107 + fVar124 * 0.0;
                      fVar136 = fVar78 * fVar116 + fVar126 * fVar108 + fVar125 * 0.0;
                      fVar94 = fVar78 * fVar118 + fVar126 * fVar110 + fVar93 * 0.0;
                      local_138 = fVar109 * fVar112 + fVar98 * fVar106 + fVar119 * fVar111;
                      fStack_134 = fVar109 * fVar114 + fVar98 * fVar107 + fVar119 * fVar124;
                      fStack_130 = fVar109 * fVar116 + fVar98 * fVar108 + fVar119 * fVar125;
                      fStack_12c = fVar109 * fVar118 + fVar98 * fVar110 + fVar119 * fVar93;
                      fVar77 = (pAVar19->p).field_0.m128[3];
                      fVar79 = (pAVar19->l).vx.field_0.m128[3];
                      fVar95 = (pAVar19->l).vy.field_0.m128[3];
                      fVar123 = (pAVar19->l).vz.field_0.m128[3];
                      fVar129 = fVar79 * fVar95 + fVar77 * fVar123;
                      fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                      fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 +
                               -fVar123 * fVar123;
                      fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                      fVar135 = fVar95 * fVar95 + fVar126 + -fVar123 * fVar123;
                      fVar134 = fVar79 * fVar123 - fVar77 * fVar95;
                      fVar102 = fVar77 * fVar95 + fVar79 * fVar123;
                      fVar137 = fVar95 * fVar123 + fVar77 * fVar79;
                      fVar92 = fVar95 * fVar123 - fVar77 * fVar79;
                      fVar77 = (pAVar19->l).vx.field_0.m128[0];
                      fVar79 = (pAVar19->l).vy.field_0.m128[0];
                      fVar78 = (pAVar19->l).vy.field_0.m128[1];
                      fVar120 = fVar123 * fVar123 + fVar126 + -fVar95 * fVar95;
                      fVar95 = (pAVar19->l).vz.field_0.m128[0];
                      fVar123 = (pAVar19->l).vz.field_0.m128[1];
                      fVar126 = (pAVar19->l).vz.field_0.m128[2];
                      fVar129 = fVar129 + fVar129;
                      fVar134 = fVar134 + fVar134;
                      fVar109 = (pAVar19->p).field_0.m128[0];
                      fVar98 = (pAVar19->p).field_0.m128[1];
                      fVar119 = (pAVar19->p).field_0.m128[2];
                      fVar100 = fVar99 * 1.0 + fVar129 * 0.0 + fVar134 * 0.0;
                      fVar101 = fVar99 * 0.0 + fVar129 * 1.0 + fVar134 * 0.0;
                      fVar134 = fVar99 * 0.0 + fVar129 * 0.0 + fVar134 * 1.0;
                      fVar105 = fVar105 + fVar105;
                      fVar137 = fVar137 + fVar137;
                      fVar102 = fVar102 + fVar102;
                      fVar92 = fVar92 + fVar92;
                      fVar99 = fVar105 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                      fVar129 = fVar105 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                      fVar105 = fVar105 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                      fVar135 = fVar102 * 1.0 + fVar92 * 0.0 + fVar120 * 0.0;
                      fVar137 = fVar102 * 0.0 + fVar92 * 1.0 + fVar120 * 0.0;
                      fVar92 = fVar102 * 0.0 + fVar92 * 0.0 + fVar120 * 1.0;
                      fVar113 = fVar77 * fVar100 + fVar99 * 0.0 + fVar135 * 0.0;
                      fVar115 = fVar77 * fVar101 + fVar129 * 0.0 + fVar137 * 0.0;
                      fVar117 = fVar77 * fVar134 + fVar105 * 0.0 + fVar92 * 0.0;
                      fVar102 = fVar79 * fVar100 + fVar78 * fVar99 + fVar135 * 0.0;
                      fVar120 = fVar79 * fVar101 + fVar78 * fVar129 + fVar137 * 0.0;
                      fVar103 = fVar79 * fVar134 + fVar78 * fVar105 + fVar92 * 0.0;
                      fVar121 = fVar95 * fVar100 + fVar123 * fVar99 + fVar126 * fVar135;
                      fVar122 = fVar95 * fVar101 + fVar123 * fVar129 + fVar126 * fVar137;
                      fVar123 = fVar95 * fVar134 + fVar123 * fVar105 + fVar126 * fVar92;
                      fVar126 = fVar109 * fVar100 + fVar98 * fVar99 + fVar119 * fVar135 +
                                (pAVar19->l).vx.field_0.m128[1] + 0.0;
                      fVar99 = fVar109 * fVar101 + fVar98 * fVar129 + fVar119 * fVar137 +
                               (pAVar19->l).vx.field_0.m128[2] + 0.0;
                      fVar109 = fVar109 * fVar134 + fVar98 * fVar105 + fVar119 * fVar92 +
                                (pAVar19->l).vy.field_0.m128[2] + 0.0;
                      fVar78 = fVar113 * fVar128 + fVar115 * fVar127 + fVar117 * local_138;
                      local_188 = fVar113 * fVar130 + fVar115 * fVar133 + fVar117 * fStack_134;
                      fVar79 = fVar113 * fVar131 + fVar115 * fVar136 + fVar117 * fStack_130;
                      fVar77 = fVar121 * fVar128 + fVar122 * fVar127 + fVar123 * local_138;
                      fVar95 = fVar121 * fVar130 + fVar122 * fVar133 + fVar123 * fStack_134;
                      fVar92 = fVar121 * fVar131 + fVar122 * fVar136 + fVar123 * fStack_130;
                      uVar70 = extraout_RDX_09;
                      fVar105 = fVar121 * fVar132 + fVar122 * fVar94 + fVar123 * fStack_12c;
                      fVar123 = fVar113 * fVar132 + fVar115 * fVar94 + fVar117 * fStack_12c;
                      fVar111 = fVar126 * fVar128 + fVar99 * fVar127 + fVar109 * local_138 +
                                fVar104 * fVar112 + fVar97 * fVar106 + fVar96 * fVar111 +
                                local_178 + 0.0;
                      fVar124 = fVar126 * fVar130 + fVar99 * fVar133 + fVar109 * fStack_134 +
                                fVar104 * fVar114 + fVar97 * fVar107 + fVar96 * fVar124 +
                                fStack_174 + 0.0;
                      fVar125 = fVar126 * fVar131 + fVar99 * fVar136 + fVar109 * fStack_130 +
                                fVar104 * fVar116 + fVar97 * fVar108 + fVar96 * fVar125 +
                                pfVar3[2] + 0.0;
                      fVar104 = fVar126 * fVar132 + fVar99 * fVar94 + fVar109 * fStack_12c +
                                fVar104 * fVar118 + fVar97 * fVar110 + fVar96 * fVar93 + 0.0;
                      fVar126 = fVar102 * fVar128 + fVar120 * fVar127 + fVar103 * local_138;
                      fVar109 = fVar102 * fVar130 + fVar120 * fVar133 + fVar103 * fStack_134;
                      fVar98 = fVar102 * fVar131 + fVar120 * fVar136 + fVar103 * fStack_130;
                      fVar119 = fVar102 * fVar132 + fVar120 * fVar94 + fVar103 * fStack_12c;
                    }
                    else {
                      bVar62 = bVar62 ^ 1 | bVar13;
                      if (bVar62 == 0) {
                        local_f8 = ZEXT416(*(uint *)(lVar16 + 0xc + lVar71));
                        local_d8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                    )ZEXT416(*(uint *)(lVar16 + -0x24 + lVar71));
                        local_c8 = ZEXT416(*(uint *)(lVar16 + -0x14 + lVar71));
                        local_108 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                     )ZEXT416(*(uint *)(lVar16 + -4 + lVar71));
                        pauVar17 = (undefined1 (*) [16])(lVar16 + -0x20 + lVar71);
                        fVar111 = *(float *)*pauVar17;
                        fVar124 = *(float *)(*pauVar17 + 4);
                        local_128 = *(undefined8 *)*pauVar17;
                        fVar125 = *(float *)(*pauVar17 + 0xc);
                        local_e8 = *pauVar17;
                        pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
                        local_118 = *pfVar3;
                        fStack_114 = pfVar3[1];
                        fStack_110 = pfVar3[2];
                        fStack_10c = pfVar3[3];
                        pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                        local_a8._0_4_ = *pfVar3;
                        fStack_9c = pfVar3[1];
                        fVar77 = (pAVar19->l).vx.field_0.m128[0];
                        fVar95 = (pAVar19->l).vx.field_0.m128[1];
                        fVar123 = (pAVar19->l).vx.field_0.m128[2];
                        fVar126 = (pAVar19->l).vy.field_0.m128[0];
                        fVar109 = (pAVar19->l).vy.field_0.m128[1];
                        fVar98 = (pAVar19->l).vy.field_0.m128[2];
                        local_48 = *(_Base_ptr *)&(pAVar19->l).vz.field_0;
                        p_Stack_40 = *(_Base_ptr *)((long)&(pAVar19->l).vz.field_0 + 8);
                        fVar119 = (pAVar19->p).field_0.m128[0];
                        fVar92 = (pAVar19->p).field_0.m128[1];
                        fVar105 = (pAVar19->p).field_0.m128[2];
                        fVar78 = fVar77 * (float)local_a8._0_4_ +
                                 fVar95 * fVar111 + fVar123 * local_118;
                        fVar104 = fVar77 * 0.0 + fVar95 * fVar124 + fVar123 * fStack_114;
                        fVar77 = fVar77 * 0.0 + fVar95 * 0.0 + fVar123 * fStack_110;
                        local_138 = fVar126 * (float)local_a8._0_4_ +
                                    fVar109 * fVar111 + fVar98 * local_118;
                        fStack_134 = fVar126 * 0.0 + fVar109 * fVar124 + fVar98 * fStack_114;
                        fStack_130 = fVar126 * 0.0 + fVar109 * 0.0 + fVar98 * fStack_110;
                        fStack_12c = fVar126 * fStack_9c + fVar109 * fVar125 + fVar98 * fStack_10c;
                        lStack_120 = (ulong)(uint)fVar125 << 0x20;
                        stack0xffffffffffffff5c = 0;
                        pfVar3 = (float *)(lVar16 + lVar71);
                        local_b8._0_4_ =
                             fVar119 * (float)local_a8._0_4_ +
                             fVar92 * fVar111 + fVar105 * local_118 + *pfVar3;
                        local_b8._4_4_ =
                             fVar119 * 0.0 + fVar92 * fVar124 + fVar105 * fStack_114 + pfVar3[1];
                        fStack_b0 = fVar119 * 0.0 + fVar92 * 0.0 + fVar105 * fStack_110 + pfVar3[2];
                        register0x0000128c =
                             fVar119 * fStack_9c + fVar92 * fVar125 + fVar105 * fStack_10c +
                             pfVar3[3];
                        if (((fVar104 != 0.0) || (NAN(fVar104))) ||
                           ((fVar77 != 0.0 ||
                            (((NAN(fVar77) || (fStack_130 != 0.0)) || (NAN(fStack_130))))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                          std::ostream::put(-0x28);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_11;
                        }
                        fVar77 = (float)local_a8._0_4_ * (float)local_48 +
                                 (float)local_128 * local_48._4_4_ + local_118 * p_Stack_40._0_4_;
                        fVar95 = (float)local_a8._4_4_ * (float)local_48 +
                                 local_128._4_4_ * local_48._4_4_ + fStack_114 * p_Stack_40._0_4_;
                        fVar92 = fStack_a0 * (float)local_48 +
                                 (float)lStack_120 * local_48._4_4_ + fStack_110 * p_Stack_40._0_4_;
                        local_168.quaternion = true;
                        fVar105 = local_108.x;
                        fVar123 = local_d8.x;
                        fVar111 = (float)local_b8._0_4_;
                        fVar124 = (float)local_b8._4_4_;
                        fVar125 = fStack_b0;
                        fVar104 = (float)local_f8._0_4_;
                        fVar126 = local_138;
                        fVar109 = fStack_134;
                        fVar98 = (float)local_e8._8_4_;
                        fVar119 = (float)local_c8._0_4_;
                      }
                      else {
                        if (((local_188 != 0.0) || (NAN(local_188))) ||
                           ((fVar79 != 0.0 ||
                            ((NAN(fVar79) ||
                             (uVar10 = *(undefined8 *)(lVar16 + -0x10 + lVar71),
                             auVar40._4_4_ = -(uint)(*(float *)(lVar16 + -0x20 + lVar71) != 0.0),
                             auVar40._0_4_ = -(uint)(*(float *)(lVar16 + -0x18 + lVar71) != 0.0),
                             auVar40._8_4_ = -(uint)((float)uVar10 != 0.0),
                             auVar40._12_4_ = -(uint)((float)((ulong)uVar10 >> 0x20) != 0.0),
                             uVar63 = movmskps((int)CONCAT71(uVar68,bVar62),auVar40),
                             (char)uVar63 != '\0')))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                          std::ostream::put(-0x28);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_10;
                        }
                        fVar77 = (pAVar19->l).vz.field_0.m128[0];
                        fVar95 = (pAVar19->l).vz.field_0.m128[1];
                        fVar78 = *(float *)(lVar16 + -0x30 + lVar71) *
                                 (pAVar19->l).vx.field_0.m128[0];
                        local_188 = (pAVar19->l).vx.field_0.m128[1] +
                                    (float)*(undefined8 *)(lVar16 + lVar71);
                        fVar79 = (pAVar19->l).vx.field_0.m128[2] +
                                 (float)((ulong)*(undefined8 *)(lVar16 + lVar71) >> 0x20);
                        fVar92 = (pAVar19->l).vz.field_0.m128[2] * *(float *)(lVar16 + -8 + lVar71);
                        local_168.quaternion = true;
                        fVar105 = (pAVar19->l).vz.field_0.m128[3];
                        fVar123 = (pAVar19->l).vx.field_0.m128[3];
                        fVar111 = (pAVar19->p).field_0.m128[0];
                        fVar124 = (pAVar19->p).field_0.m128[1];
                        fVar125 = (pAVar19->p).field_0.m128[2];
                        fVar104 = (pAVar19->p).field_0.m128[3];
                        fVar126 = (pAVar19->l).vy.field_0.m128[0];
                        fVar109 = (pAVar19->l).vy.field_0.m128[1] *
                                  *(float *)(lVar16 + -0x1c + lVar71);
                        fVar98 = (pAVar19->l).vy.field_0.m128[2] + *(float *)(lVar16 + 8 + lVar71);
                        fVar119 = (pAVar19->l).vy.field_0.m128[3];
                      }
                    }
                  }
                }
                else {
                  pfVar3 = (float *)(lVar16 + -0x24 + lVar71);
                  auVar37._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar37._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar37._8_4_ = -(uint)(pfVar3[2] != 1.0);
                  auVar37._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar73 = movmskps(uVar73,auVar37);
                  if ((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                     (((uVar73 & 4) != 0 ||
                      (bVar69 = ((byte)uVar73 & 8) >> 3,
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 != 0))))
                  goto LAB_00158508;
                  pfVar3 = (float *)(lVar16 + -0x14 + lVar71);
                  auVar38._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar38._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar38._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar38._12_4_ = -(uint)(pfVar3[3] != 1.0);
                  uVar73 = movmskps(uVar73,auVar38);
                  if (((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                      ((uVar73 & 4) != 0)) ||
                     (bVar69 = ((byte)uVar73 & 8) >> 3,
                     uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 != 0)) goto LAB_00158508;
                  pfVar3 = (float *)(lVar16 + -4 + lVar71);
                  auVar39._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar39._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar39._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar39._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar73 = movmskps(uVar73,auVar39);
                  if ((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0)
                     ) goto LAB_00158508;
                  bVar69 = ((byte)uVar73 & 8) >> 3;
                  uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69);
                  uVar70 = (ulong)uVar73;
                  if ((bVar69 != 0) ||
                     ((bVar62 != 0 &&
                      ((fVar77 = *(float *)(lVar16 + 0xc + lVar71), fVar77 != 1.0 || (NAN(fVar77))))
                      ))) goto LAB_00158508;
                  fVar78 = (pAVar19->l).vx.field_0.m128[0];
                  local_188 = (pAVar19->l).vx.field_0.m128[1];
                  fVar79 = (pAVar19->l).vx.field_0.m128[2];
                  fVar123 = (pAVar19->l).vx.field_0.m128[3];
                  fVar126 = (pAVar19->l).vy.field_0.m128[0];
                  fVar109 = (pAVar19->l).vy.field_0.m128[1];
                  fVar98 = (pAVar19->l).vy.field_0.m128[2];
                  fVar119 = (pAVar19->l).vy.field_0.m128[3];
                  fVar77 = (pAVar19->l).vz.field_0.m128[0];
                  fVar95 = (pAVar19->l).vz.field_0.m128[1];
                  fVar92 = (pAVar19->l).vz.field_0.m128[2];
                  fVar105 = (pAVar19->l).vz.field_0.m128[3];
                  fVar111 = (pAVar19->p).field_0.m128[0];
                  fVar124 = (pAVar19->p).field_0.m128[1];
                  fVar125 = (pAVar19->p).field_0.m128[2];
                  fVar104 = (pAVar19->p).field_0.m128[3];
                  local_168.quaternion = bVar13;
                }
LAB_00158c50:
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x30);
                *pfVar3 = fVar78;
                pfVar3[1] = local_188;
                pfVar3[2] = fVar79;
                pfVar3[3] = fVar123;
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x20);
                *pfVar3 = fVar126;
                pfVar3[1] = fVar109;
                pfVar3[2] = fVar98;
                pfVar3[3] = fVar119;
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x10);
                *pfVar3 = fVar77;
                pfVar3[1] = fVar95;
                pfVar3[2] = fVar92;
                pfVar3[3] = fVar105;
                pfVar3 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar71);
                *pfVar3 = fVar111;
                pfVar3[1] = fVar124;
                pfVar3[2] = fVar125;
                pfVar3[3] = fVar104;
                uVar72 = uVar72 + 1;
                lVar71 = lVar71 + 0x40;
                pAVar66 = local_168.spaces.items;
              } while (uVar72 < (ulong)puVar6[2]);
            }
          }
          else {
            if (sVar15 != sVar18) {
              prVar67 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar67,"number of transformations does not match");
              __cxa_throw(prVar67,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            fVar77 = (float)*puVar6;
            fVar79 = (float)((ulong)*puVar6 >> 0x20);
            fVar95 = (spaces->time_range).lower;
            fVar123 = (spaces->time_range).upper;
            uVar73 = -(uint)(fVar77 < fVar95);
            uVar75 = -(uint)(fVar79 < fVar123);
            local_168.time_range =
                 (BBox1f)(CONCAT44(~uVar75 & (uint)fVar123,~uVar73 & (uint)fVar77) |
                         CONCAT44((uint)fVar79 & uVar75,(uint)fVar95 & uVar73));
            local_168.spaces.size_active = 0;
            local_168.spaces.size_alloced = 0;
            local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
            if (sVar15 != 0) {
              local_168.spaces.items =
                   (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                   alignedMalloc(sVar15 << 6,0x10);
              uVar70 = extraout_RDX_12;
              local_168.spaces.size_alloced = sVar15;
            }
            pAVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
            if (*(char *)(puVar6 + 5) == '\0') {
              pAVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                        (ulong)*(uint *)&spaces->quaternion;
            }
            local_168.quaternion = SUB81(pAVar66,0);
            local_168.spaces.size_active = local_168.spaces.size_alloced;
            if (puVar6[2] != 0) {
              lVar71 = 0x30;
              uVar72 = 0;
              do {
                uVar73 = (uint)uVar70;
                lVar16 = puVar6[4];
                pAVar19 = (spaces->spaces).items;
                bVar62 = *(byte *)(puVar6 + 5);
                uVar68 = (undefined7)((ulong)pAVar66 >> 8);
                uVar65 = CONCAT71(uVar68,bVar62);
                bVar13 = spaces->quaternion;
                local_168.quaternion = false;
                fVar77 = *(float *)(lVar16 + -0x30 + lVar71);
                uVar10 = *(undefined8 *)(lVar16 + -0x2c + lVar71);
                fVar79 = (float)((ulong)uVar10 >> 0x20);
                local_188 = (float)uVar10;
                if (((((fVar77 != 1.0) || (NAN(fVar77))) || (local_188 != 0.0)) ||
                    ((NAN(local_188) || (fVar79 != 0.0)))) || (NAN(fVar79))) {
LAB_001591e5:
                  uVar10 = *(undefined8 *)((long)pAVar19 + lVar71 + -0x30);
                  fVar95 = (float)uVar10;
                  fVar123 = (float)((ulong)uVar10 >> 0x20);
                  iVar74 = -(uint)(fVar95 != 1.0);
                  iVar76 = -(uint)(fVar123 != 0.0);
                  auVar87._4_4_ = iVar76;
                  auVar87._0_4_ = iVar74;
                  auVar87._8_4_ = iVar76;
                  auVar87._12_4_ = iVar76;
                  auVar86._8_8_ = auVar87._8_8_;
                  auVar86._4_4_ = iVar74;
                  auVar86._0_4_ = iVar74;
                  uVar73 = movmskpd(uVar73,auVar86);
                  fVar77 = *(float *)((long)pAVar19 + lVar71 + -0x28);
                  if (((uVar73 & 1) == 0) &&
                     (((bVar69 = (byte)uVar73 >> 1, bVar69 == 0 && (fVar77 == 0.0)) &&
                      (!NAN(fVar77))))) {
                    pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x24);
                    auVar59._4_4_ = -(uint)(pfVar3[1] != 0.0);
                    auVar59._0_4_ = -(uint)(*pfVar3 != 0.0);
                    auVar59._8_4_ = -(uint)(pfVar3[2] != 1.0);
                    auVar59._12_4_ = -(uint)(pfVar3[3] != 0.0);
                    uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar59);
                    if ((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                       (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                      pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x14);
                      auVar60._4_4_ = -(uint)(pfVar3[1] != 0.0);
                      auVar60._0_4_ = -(uint)(*pfVar3 != 0.0);
                      auVar60._8_4_ = -(uint)(pfVar3[2] != 0.0);
                      auVar60._12_4_ = -(uint)(pfVar3[3] != 1.0);
                      uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar60);
                      if ((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                         (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                        pfVar3 = (float *)((long)pAVar19 + lVar71 + -4);
                        auVar61._4_4_ = -(uint)(pfVar3[1] != 0.0);
                        auVar61._0_4_ = -(uint)(*pfVar3 != 0.0);
                        auVar61._8_4_ = -(uint)(pfVar3[2] != 0.0);
                        auVar61._12_4_ = -(uint)(pfVar3[3] != 0.0);
                        uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar61);
                        if ((((((bVar13 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                             ((uVar73 & 4) == 0)) &&
                            (bVar69 = ((byte)uVar73 & 8) >> 3,
                            uVar70 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 == 0)) &&
                           ((bVar13 == false ||
                            ((fVar78 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 0xc),
                             fVar78 == 1.0 && (!NAN(fVar78))))))) {
                          pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                          fVar78 = *pfVar3;
                          local_188 = pfVar3[1];
                          fVar79 = pfVar3[2];
                          fVar123 = pfVar3[3];
                          pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
                          fVar126 = *pfVar3;
                          fVar109 = pfVar3[1];
                          fVar98 = pfVar3[2];
                          fVar119 = pfVar3[3];
                          pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
                          fVar77 = *pfVar3;
                          fVar95 = pfVar3[1];
                          fVar92 = pfVar3[2];
                          fVar105 = pfVar3[3];
                          pfVar3 = (float *)(lVar16 + lVar71);
                          fVar111 = *pfVar3;
                          fVar124 = pfVar3[1];
                          fVar125 = pfVar3[2];
                          fVar104 = pfVar3[3];
                          local_168.quaternion = (bool)bVar62;
                          goto LAB_00159944;
                        }
                      }
                    }
                  }
                  uVar70 = uVar65 & 0xffffffff;
                  bVar69 = (byte)uVar70 | bVar13;
                  uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
                  if (bVar69 == 0) {
                    pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                    fVar125 = *pfVar3;
                    fVar127 = pfVar3[1];
                    fVar133 = pfVar3[2];
                    fVar136 = pfVar3[3];
                    pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
                    fVar93 = *pfVar3;
                    fVar94 = pfVar3[1];
                    fVar99 = pfVar3[2];
                    fVar129 = pfVar3[3];
                    pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
                    fVar100 = *pfVar3;
                    fVar101 = pfVar3[1];
                    fVar134 = pfVar3[2];
                    fVar102 = pfVar3[3];
                    fVar78 = fVar95 * fVar125 + fVar123 * fVar93 + fVar77 * fVar100;
                    local_188 = fVar95 * fVar127 + fVar123 * fVar94 + fVar77 * fVar101;
                    fVar79 = fVar95 * fVar133 + fVar123 * fVar99 + fVar77 * fVar134;
                    fVar123 = fVar95 * fVar136 + fVar123 * fVar129 + fVar77 * fVar102;
                    fVar77 = *(float *)((long)pAVar19 + lVar71 + -0x20);
                    fVar95 = *(float *)((long)pAVar19 + lVar71 + -0x1c);
                    fVar119 = *(float *)((long)pAVar19 + lVar71 + -0x18);
                    fVar105 = *(float *)((long)pAVar19 + lVar71 + -0x10);
                    fVar126 = fVar77 * fVar125 + fVar95 * fVar93 + fVar119 * fVar100;
                    fVar109 = fVar77 * fVar127 + fVar95 * fVar94 + fVar119 * fVar101;
                    fVar98 = fVar77 * fVar133 + fVar95 * fVar99 + fVar119 * fVar134;
                    fVar119 = fVar77 * fVar136 + fVar95 * fVar129 + fVar119 * fVar102;
                    fVar111 = *(float *)((long)pAVar19 + lVar71 + -0xc);
                    fVar124 = *(float *)((long)pAVar19 + lVar71 + -8);
                    fVar77 = fVar105 * fVar125 + fVar111 * fVar93 + fVar124 * fVar100;
                    fVar95 = fVar105 * fVar127 + fVar111 * fVar94 + fVar124 * fVar101;
                    fVar92 = fVar105 * fVar133 + fVar111 * fVar99 + fVar124 * fVar134;
                    fVar105 = fVar105 * fVar136 + fVar111 * fVar129 + fVar124 * fVar102;
                    fVar104 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                    fVar97 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 4);
                    fVar96 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 8);
                    pfVar3 = (float *)(lVar16 + lVar71);
                    fVar111 = fVar104 * fVar125 + fVar97 * fVar93 + fVar96 * fVar100 + *pfVar3;
                    fVar124 = fVar104 * fVar127 + fVar97 * fVar94 + fVar96 * fVar101 + pfVar3[1];
                    fVar125 = fVar104 * fVar133 + fVar97 * fVar99 + fVar96 * fVar134 + pfVar3[2];
                    fVar104 = fVar104 * fVar136 + fVar97 * fVar129 + fVar96 * fVar102 + pfVar3[3];
                  }
                  else {
                    uVar65 = uVar65 & 0xffffffff;
                    bVar69 = (byte)uVar65 & bVar13;
                    uVar70 = CONCAT71((int7)(uVar65 >> 8),bVar69);
                    if (bVar69 == 1) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                                 ,0x67);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                      std::ostream::put(-0x28);
                      std::ostream::flush();
                      fVar77 = *(float *)(lVar16 + 0xc + lVar71);
                      fVar79 = *(float *)(lVar16 + -0x24 + lVar71);
                      fVar95 = *(float *)(lVar16 + -0x14 + lVar71);
                      fVar123 = *(float *)(lVar16 + -4 + lVar71);
                      auVar12 = *(undefined1 (*) [16])(lVar16 + -0x30 + lVar71);
                      pfVar4 = (float *)(lVar16 + -0x20 + lVar71);
                      fVar78 = *pfVar4;
                      fVar126 = pfVar4[1];
                      pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
                      fVar109 = *pfVar3;
                      fVar98 = pfVar3[1];
                      fVar119 = pfVar3[2];
                      fVar127 = fVar79 * fVar95 + fVar77 * fVar123;
                      fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                      fVar111 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 +
                                -fVar123 * fVar123;
                      fVar124 = fVar77 * fVar77 - fVar79 * fVar79;
                      fVar125 = fVar95 * fVar95 + fVar124 + -fVar123 * fVar123;
                      fVar136 = fVar79 * fVar123 - fVar77 * fVar95;
                      fVar92 = fVar77 * fVar95 + fVar79 * fVar123;
                      fVar133 = fVar95 * fVar123 + fVar77 * fVar79;
                      fVar77 = fVar95 * fVar123 - fVar77 * fVar79;
                      pfVar3 = (float *)(lVar16 + lVar71);
                      fVar104 = *pfVar3;
                      fVar97 = pfVar3[1];
                      fVar96 = pfVar3[2];
                      fVar127 = fVar127 + fVar127;
                      fVar136 = fVar136 + fVar136;
                      fVar105 = fVar105 + fVar105;
                      fVar133 = fVar133 + fVar133;
                      fVar92 = fVar92 + fVar92;
                      fVar77 = fVar77 + fVar77;
                      fVar79 = fVar123 * fVar123 + fVar124 + -fVar95 * fVar95;
                      fVar112 = fVar111 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                      fVar114 = fVar111 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                      fVar116 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                      fVar118 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                      fVar106 = fVar105 * 1.0 + fVar125 * 0.0 + fVar133 * 0.0;
                      fVar107 = fVar105 * 0.0 + fVar125 * 1.0 + fVar133 * 0.0;
                      fVar108 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 1.0;
                      fVar110 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 0.0;
                      fVar111 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                      fVar124 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                      fVar125 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                      fVar93 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                      local_178 = auVar12._4_4_;
                      fStack_174 = auVar12._8_4_;
                      local_188 = auVar12._0_4_;
                      fVar128 = local_188 * fVar112 + fVar106 * 0.0 + fVar111 * 0.0;
                      fVar130 = local_188 * fVar114 + fVar107 * 0.0 + fVar124 * 0.0;
                      fVar131 = local_188 * fVar116 + fVar108 * 0.0 + fVar125 * 0.0;
                      fVar132 = local_188 * fVar118 + fVar110 * 0.0 + fVar93 * 0.0;
                      fVar127 = fVar78 * fVar112 + fVar126 * fVar106 + fVar111 * 0.0;
                      fVar133 = fVar78 * fVar114 + fVar126 * fVar107 + fVar124 * 0.0;
                      fVar136 = fVar78 * fVar116 + fVar126 * fVar108 + fVar125 * 0.0;
                      fVar94 = fVar78 * fVar118 + fVar126 * fVar110 + fVar93 * 0.0;
                      local_138 = fVar109 * fVar112 + fVar98 * fVar106 + fVar119 * fVar111;
                      fStack_134 = fVar109 * fVar114 + fVar98 * fVar107 + fVar119 * fVar124;
                      fStack_130 = fVar109 * fVar116 + fVar98 * fVar108 + fVar119 * fVar125;
                      fStack_12c = fVar109 * fVar118 + fVar98 * fVar110 + fVar119 * fVar93;
                      fVar77 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 0xc);
                      fVar79 = *(float *)((long)pAVar19 + lVar71 + -0x24);
                      fVar95 = *(float *)((long)pAVar19 + lVar71 + -0x14);
                      fVar123 = *(float *)((long)pAVar19 + lVar71 + -4);
                      fVar129 = fVar79 * fVar95 + fVar77 * fVar123;
                      fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                      fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 +
                               -fVar123 * fVar123;
                      fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                      fVar135 = fVar95 * fVar95 + fVar126 + -fVar123 * fVar123;
                      fVar134 = fVar79 * fVar123 - fVar77 * fVar95;
                      fVar102 = fVar77 * fVar95 + fVar79 * fVar123;
                      fVar137 = fVar95 * fVar123 + fVar77 * fVar79;
                      fVar92 = fVar95 * fVar123 - fVar77 * fVar79;
                      pfVar5 = (float *)((long)pAVar19 + lVar71 + -0x30);
                      fVar77 = *pfVar5;
                      pfVar9 = (float *)((long)pAVar19 + lVar71 + -0x20);
                      fVar79 = *pfVar9;
                      fVar78 = pfVar9[1];
                      fVar120 = fVar123 * fVar123 + fVar126 + -fVar95 * fVar95;
                      pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x10);
                      fVar95 = *pfVar3;
                      fVar123 = pfVar3[1];
                      fVar126 = pfVar3[2];
                      fVar129 = fVar129 + fVar129;
                      fVar134 = fVar134 + fVar134;
                      pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                      fVar109 = *pfVar3;
                      fVar98 = pfVar3[1];
                      fVar119 = pfVar3[2];
                      fVar100 = fVar99 * 1.0 + fVar129 * 0.0 + fVar134 * 0.0;
                      fVar101 = fVar99 * 0.0 + fVar129 * 1.0 + fVar134 * 0.0;
                      fVar134 = fVar99 * 0.0 + fVar129 * 0.0 + fVar134 * 1.0;
                      fVar105 = fVar105 + fVar105;
                      fVar137 = fVar137 + fVar137;
                      fVar102 = fVar102 + fVar102;
                      fVar92 = fVar92 + fVar92;
                      fVar99 = fVar105 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                      fVar129 = fVar105 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                      fVar105 = fVar105 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                      fVar135 = fVar102 * 1.0 + fVar92 * 0.0 + fVar120 * 0.0;
                      fVar137 = fVar102 * 0.0 + fVar92 * 1.0 + fVar120 * 0.0;
                      fVar92 = fVar102 * 0.0 + fVar92 * 0.0 + fVar120 * 1.0;
                      fVar113 = fVar77 * fVar100 + fVar99 * 0.0 + fVar135 * 0.0;
                      fVar115 = fVar77 * fVar101 + fVar129 * 0.0 + fVar137 * 0.0;
                      fVar117 = fVar77 * fVar134 + fVar105 * 0.0 + fVar92 * 0.0;
                      fVar102 = fVar79 * fVar100 + fVar78 * fVar99 + fVar135 * 0.0;
                      fVar120 = fVar79 * fVar101 + fVar78 * fVar129 + fVar137 * 0.0;
                      fVar103 = fVar79 * fVar134 + fVar78 * fVar105 + fVar92 * 0.0;
                      fVar121 = fVar95 * fVar100 + fVar123 * fVar99 + fVar126 * fVar135;
                      fVar122 = fVar95 * fVar101 + fVar123 * fVar129 + fVar126 * fVar137;
                      fVar123 = fVar95 * fVar134 + fVar123 * fVar105 + fVar126 * fVar92;
                      fVar126 = fVar109 * fVar100 + fVar98 * fVar99 + fVar119 * fVar135 +
                                pfVar5[1] + 0.0;
                      fVar99 = fVar109 * fVar101 + fVar98 * fVar129 + fVar119 * fVar137 +
                               pfVar5[2] + 0.0;
                      fVar109 = fVar109 * fVar134 + fVar98 * fVar105 + fVar119 * fVar92 +
                                pfVar9[2] + 0.0;
                      fVar78 = fVar113 * fVar128 + fVar115 * fVar127 + fVar117 * local_138;
                      local_188 = fVar113 * fVar130 + fVar115 * fVar133 + fVar117 * fStack_134;
                      fVar79 = fVar113 * fVar131 + fVar115 * fVar136 + fVar117 * fStack_130;
                      fVar77 = fVar121 * fVar128 + fVar122 * fVar127 + fVar123 * local_138;
                      fVar95 = fVar121 * fVar130 + fVar122 * fVar133 + fVar123 * fStack_134;
                      fVar92 = fVar121 * fVar131 + fVar122 * fVar136 + fVar123 * fStack_130;
                      uVar70 = extraout_RDX_13;
                      fVar105 = fVar121 * fVar132 + fVar122 * fVar94 + fVar123 * fStack_12c;
                      fVar123 = fVar113 * fVar132 + fVar115 * fVar94 + fVar117 * fStack_12c;
                      fVar111 = fVar126 * fVar128 + fVar99 * fVar127 + fVar109 * local_138 +
                                fVar104 * fVar112 + fVar97 * fVar106 + fVar96 * fVar111 +
                                local_178 + 0.0;
                      fVar124 = fVar126 * fVar130 + fVar99 * fVar133 + fVar109 * fStack_134 +
                                fVar104 * fVar114 + fVar97 * fVar107 + fVar96 * fVar124 +
                                fStack_174 + 0.0;
                      fVar125 = fVar126 * fVar131 + fVar99 * fVar136 + fVar109 * fStack_130 +
                                fVar104 * fVar116 + fVar97 * fVar108 + fVar96 * fVar125 +
                                pfVar4[2] + 0.0;
                      fVar104 = fVar126 * fVar132 + fVar99 * fVar94 + fVar109 * fStack_12c +
                                fVar104 * fVar118 + fVar97 * fVar110 + fVar96 * fVar93 + 0.0;
                      fVar126 = fVar102 * fVar128 + fVar120 * fVar127 + fVar103 * local_138;
                      fVar109 = fVar102 * fVar130 + fVar120 * fVar133 + fVar103 * fStack_134;
                      fVar98 = fVar102 * fVar131 + fVar120 * fVar136 + fVar103 * fStack_130;
                      fVar119 = fVar102 * fVar132 + fVar120 * fVar94 + fVar103 * fStack_12c;
                    }
                    else {
                      bVar62 = bVar62 ^ 1 | bVar13;
                      if (bVar62 == 0) {
                        local_f8 = ZEXT416(*(uint *)(lVar16 + 0xc + lVar71));
                        local_d8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                    )ZEXT416(*(uint *)(lVar16 + -0x24 + lVar71));
                        local_c8 = ZEXT416(*(uint *)(lVar16 + -0x14 + lVar71));
                        local_108 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                                     )ZEXT416(*(uint *)(lVar16 + -4 + lVar71));
                        pauVar17 = (undefined1 (*) [16])(lVar16 + -0x20 + lVar71);
                        fVar111 = *(float *)*pauVar17;
                        fVar124 = *(float *)(*pauVar17 + 4);
                        local_128 = *(undefined8 *)*pauVar17;
                        fVar125 = *(float *)(*pauVar17 + 0xc);
                        local_e8 = *pauVar17;
                        pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
                        local_118 = *pfVar3;
                        fStack_114 = pfVar3[1];
                        fStack_110 = pfVar3[2];
                        fStack_10c = pfVar3[3];
                        pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                        local_a8._0_4_ = *pfVar3;
                        fStack_9c = pfVar3[1];
                        pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x30);
                        fVar77 = *pfVar3;
                        fVar95 = pfVar3[1];
                        fVar123 = pfVar3[2];
                        pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x20);
                        fVar126 = *pfVar3;
                        fVar109 = pfVar3[1];
                        fVar98 = pfVar3[2];
                        puVar7 = (undefined8 *)((long)pAVar19 + lVar71 + -0x10);
                        local_48 = (_Base_ptr)*puVar7;
                        p_Stack_40 = (_Base_ptr)puVar7[1];
                        pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                        fVar119 = *pfVar3;
                        fVar92 = pfVar3[1];
                        fVar105 = pfVar3[2];
                        fVar78 = fVar77 * (float)local_a8._0_4_ +
                                 fVar95 * fVar111 + fVar123 * local_118;
                        fVar104 = fVar77 * 0.0 + fVar95 * fVar124 + fVar123 * fStack_114;
                        fVar77 = fVar77 * 0.0 + fVar95 * 0.0 + fVar123 * fStack_110;
                        local_138 = fVar126 * (float)local_a8._0_4_ +
                                    fVar109 * fVar111 + fVar98 * local_118;
                        fStack_134 = fVar126 * 0.0 + fVar109 * fVar124 + fVar98 * fStack_114;
                        fStack_130 = fVar126 * 0.0 + fVar109 * 0.0 + fVar98 * fStack_110;
                        fStack_12c = fVar126 * fStack_9c + fVar109 * fVar125 + fVar98 * fStack_10c;
                        lStack_120 = (ulong)(uint)fVar125 << 0x20;
                        stack0xffffffffffffff5c = 0;
                        pfVar3 = (float *)(lVar16 + lVar71);
                        local_b8._0_4_ =
                             fVar119 * (float)local_a8._0_4_ +
                             fVar92 * fVar111 + fVar105 * local_118 + *pfVar3;
                        local_b8._4_4_ =
                             fVar119 * 0.0 + fVar92 * fVar124 + fVar105 * fStack_114 + pfVar3[1];
                        fStack_b0 = fVar119 * 0.0 + fVar92 * 0.0 + fVar105 * fStack_110 + pfVar3[2];
                        register0x0000128c =
                             fVar119 * fStack_9c + fVar92 * fVar125 + fVar105 * fStack_10c +
                             pfVar3[3];
                        if (((fVar104 != 0.0) || (NAN(fVar104))) ||
                           ((fVar77 != 0.0 ||
                            (((NAN(fVar77) || (fStack_130 != 0.0)) || (NAN(fStack_130))))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                     ,0x61);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                          std::ostream::put(-0x28);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_15;
                        }
                        fVar77 = (float)local_a8._0_4_ * (float)local_48 +
                                 (float)local_128 * local_48._4_4_ + local_118 * p_Stack_40._0_4_;
                        fVar95 = (float)local_a8._4_4_ * (float)local_48 +
                                 local_128._4_4_ * local_48._4_4_ + fStack_114 * p_Stack_40._0_4_;
                        fVar92 = fStack_a0 * (float)local_48 +
                                 (float)lStack_120 * local_48._4_4_ + fStack_110 * p_Stack_40._0_4_;
                        local_168.quaternion = true;
                        fVar105 = local_108.x;
                        fVar123 = local_d8.x;
                        fVar111 = (float)local_b8._0_4_;
                        fVar124 = (float)local_b8._4_4_;
                        fVar125 = fStack_b0;
                        fVar104 = (float)local_f8._0_4_;
                        fVar126 = local_138;
                        fVar109 = fStack_134;
                        fVar98 = (float)local_e8._8_4_;
                        fVar119 = (float)local_c8._0_4_;
                      }
                      else {
                        if (((local_188 != 0.0) || (NAN(local_188))) ||
                           ((fVar79 != 0.0 ||
                            ((NAN(fVar79) ||
                             (uVar10 = *(undefined8 *)(lVar16 + -0x10 + lVar71),
                             auVar43._4_4_ = -(uint)(*(float *)(lVar16 + -0x20 + lVar71) != 0.0),
                             auVar43._0_4_ = -(uint)(*(float *)(lVar16 + -0x18 + lVar71) != 0.0),
                             auVar43._8_4_ = -(uint)((float)uVar10 != 0.0),
                             auVar43._12_4_ = -(uint)((float)((ulong)uVar10 >> 0x20) != 0.0),
                             uVar63 = movmskps((int)CONCAT71(uVar68,bVar62),auVar43),
                             (char)uVar63 != '\0')))))) {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                     ,0x83);
                          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                          std::ostream::put(-0x28);
                          std::ostream::flush();
                          uVar70 = extraout_RDX_14;
                        }
                        pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x30);
                        pfVar5 = (float *)((long)pAVar19 + lVar71 + -0x20);
                        pfVar9 = (float *)((long)pAVar19 + lVar71 + -0x10);
                        fVar77 = *pfVar9;
                        fVar95 = pfVar9[1];
                        pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                        fVar78 = *(float *)(lVar16 + -0x30 + lVar71) * *pfVar4;
                        local_188 = pfVar4[1] + (float)*(undefined8 *)(lVar16 + lVar71);
                        fVar79 = pfVar4[2] +
                                 (float)((ulong)*(undefined8 *)(lVar16 + lVar71) >> 0x20);
                        fVar92 = pfVar9[2] * *(float *)(lVar16 + -8 + lVar71);
                        local_168.quaternion = true;
                        fVar105 = pfVar9[3];
                        fVar123 = pfVar4[3];
                        fVar111 = *pfVar3;
                        fVar124 = pfVar3[1];
                        fVar125 = pfVar3[2];
                        fVar104 = pfVar3[3];
                        fVar126 = *pfVar5;
                        fVar109 = pfVar5[1] * *(float *)(lVar16 + -0x1c + lVar71);
                        fVar98 = pfVar5[2] + *(float *)(lVar16 + 8 + lVar71);
                        fVar119 = pfVar5[3];
                      }
                    }
                  }
                }
                else {
                  pfVar3 = (float *)(lVar16 + -0x24 + lVar71);
                  auVar12._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar12._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar12._8_4_ = -(uint)(pfVar3[2] != 1.0);
                  auVar12._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar73 = movmskps(uVar73,auVar12);
                  if ((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                     (((uVar73 & 4) != 0 ||
                      (bVar69 = ((byte)uVar73 & 8) >> 3,
                      uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 != 0))))
                  goto LAB_001591e5;
                  pfVar3 = (float *)(lVar16 + -0x14 + lVar71);
                  auVar41._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar41._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar41._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar41._12_4_ = -(uint)(pfVar3[3] != 1.0);
                  uVar73 = movmskps(uVar73,auVar41);
                  if (((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                      ((uVar73 & 4) != 0)) ||
                     (bVar69 = ((byte)uVar73 & 8) >> 3,
                     uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 != 0)) goto LAB_001591e5;
                  pfVar3 = (float *)(lVar16 + -4 + lVar71);
                  auVar42._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar42._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar42._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar42._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar73 = movmskps(uVar73,auVar42);
                  if ((((bVar62 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0)
                     ) goto LAB_001591e5;
                  bVar69 = ((byte)uVar73 & 8) >> 3;
                  uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69);
                  uVar70 = (ulong)uVar73;
                  if ((bVar69 != 0) ||
                     ((bVar62 != 0 &&
                      ((fVar77 = *(float *)(lVar16 + 0xc + lVar71), fVar77 != 1.0 || (NAN(fVar77))))
                      ))) goto LAB_001591e5;
                  pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x30);
                  fVar78 = *pfVar3;
                  local_188 = pfVar3[1];
                  fVar79 = pfVar3[2];
                  fVar123 = pfVar3[3];
                  pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x20);
                  fVar126 = *pfVar3;
                  fVar109 = pfVar3[1];
                  fVar98 = pfVar3[2];
                  fVar119 = pfVar3[3];
                  pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x10);
                  fVar77 = *pfVar3;
                  fVar95 = pfVar3[1];
                  fVar92 = pfVar3[2];
                  fVar105 = pfVar3[3];
                  pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                  fVar111 = *pfVar3;
                  fVar124 = pfVar3[1];
                  fVar125 = pfVar3[2];
                  fVar104 = pfVar3[3];
                  local_168.quaternion = bVar13;
                }
LAB_00159944:
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x30);
                *pfVar3 = fVar78;
                pfVar3[1] = local_188;
                pfVar3[2] = fVar79;
                pfVar3[3] = fVar123;
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x20);
                *pfVar3 = fVar126;
                pfVar3[1] = fVar109;
                pfVar3[2] = fVar98;
                pfVar3[3] = fVar119;
                pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x10);
                *pfVar3 = fVar77;
                pfVar3[1] = fVar95;
                pfVar3[2] = fVar92;
                pfVar3[3] = fVar105;
                pfVar3 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar71);
                *pfVar3 = fVar111;
                pfVar3[1] = fVar124;
                pfVar3[2] = fVar125;
                pfVar3[3] = fVar104;
                uVar72 = uVar72 + 1;
                lVar71 = lVar71 + 0x40;
                pAVar66 = local_168.spaces.items;
              } while (uVar72 < (ulong)puVar6[2]);
            }
          }
        }
        std::
        vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
        ::emplace_back<embree::SceneGraph::Transformations>(&local_68,&local_168);
        alignedFree(local_168.spaces.items);
        uVar72 = local_88 + 1;
        lVar71 = local_78[0xd];
        uVar70 = 0xaaaaaaaaaaaaaaab;
        plVar64 = local_78;
      } while (uVar72 < (ulong)((local_78[0xe] - lVar71 >> 4) * -0x5555555555555555));
    }
    convertInstances(local_90,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                               *)local_98,(Ref<embree::SceneGraph::Node> *)(plVar64 + 0x10),
                     &local_68);
    std::
    vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
    ::~vector(&local_68);
    (**(code **)(*plVar64 + 0x18))(plVar64);
    return;
  }
  (**(code **)(*plVar64 + 0x10))(plVar64);
  sVar15 = (spaces->spaces).size_active;
  if (sVar15 == 1) {
    fVar77 = (spaces->time_range).lower;
    fVar79 = (spaces->time_range).upper;
    fVar95 = (float)plVar64[0xd];
    fVar123 = (float)((ulong)plVar64[0xd] >> 0x20);
    uVar73 = -(uint)(fVar77 < fVar95);
    uVar75 = -(uint)(fVar79 < fVar123);
    local_168.time_range =
         (BBox1f)(CONCAT44(~uVar75 & (uint)fVar123,~uVar73 & (uint)fVar77) |
                 CONCAT44((uint)fVar79 & uVar75,(uint)fVar95 & uVar73));
    sVar15 = plVar64[0xf];
    local_168.spaces.size_active = 0;
    local_168.spaces.size_alloced = 0;
    local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    if (sVar15 == 0) {
      local_168.quaternion = false;
    }
    else {
      local_168.spaces.items =
           (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar15 << 6,0x10);
      local_168.quaternion = false;
      local_168.spaces.size_active = sVar15;
      local_168.spaces.size_alloced = sVar15;
      if (plVar64[0xf] != 0) {
        lVar71 = 0x30;
        uVar72 = 0;
        uVar70 = extraout_RDX;
        do {
          uVar73 = (uint)uVar70;
          pAVar66 = (spaces->spaces).items;
          lVar16 = plVar64[0x11];
          bVar13 = spaces->quaternion;
          uVar68 = (undefined7)((ulong)local_168.spaces.items >> 8);
          uVar65 = CONCAT71(uVar68,bVar13);
          bVar62 = *(byte *)(plVar64 + 0x12);
          local_168.quaternion = false;
          fVar77 = (pAVar66->l).vx.field_0.m128[0];
          uVar10 = *(undefined8 *)((long)&(pAVar66->l).vx.field_0 + 4);
          fVar79 = (float)((ulong)uVar10 >> 0x20);
          local_188 = (float)uVar10;
          if ((((fVar77 != 1.0) || (NAN(fVar77))) || (local_188 != 0.0)) ||
             (((NAN(local_188) || (fVar79 != 0.0)) || (NAN(fVar79))))) {
LAB_00156af2:
            uVar10 = *(undefined8 *)(lVar16 + -0x30 + lVar71);
            fVar95 = (float)uVar10;
            fVar123 = (float)((ulong)uVar10 >> 0x20);
            iVar74 = -(uint)(fVar95 != 1.0);
            iVar76 = -(uint)(fVar123 != 0.0);
            auVar81._4_4_ = iVar76;
            auVar81._0_4_ = iVar74;
            auVar81._8_4_ = iVar76;
            auVar81._12_4_ = iVar76;
            auVar80._8_8_ = auVar81._8_8_;
            auVar80._4_4_ = iVar74;
            auVar80._0_4_ = iVar74;
            uVar73 = movmskpd(uVar73,auVar80);
            fVar77 = *(float *)(lVar16 + -0x28 + lVar71);
            if (((uVar73 & 1) == 0) &&
               (((bVar69 = (byte)uVar73 >> 1, bVar69 == 0 && (fVar77 == 0.0)) && (!NAN(fVar77))))) {
              pfVar3 = (float *)(lVar16 + -0x24 + lVar71);
              auVar44._4_4_ = -(uint)(pfVar3[1] != 0.0);
              auVar44._0_4_ = -(uint)(*pfVar3 != 0.0);
              auVar44._8_4_ = -(uint)(pfVar3[2] != 1.0);
              auVar44._12_4_ = -(uint)(pfVar3[3] != 0.0);
              uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar44);
              if ((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                 (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                pfVar3 = (float *)(lVar16 + -0x14 + lVar71);
                auVar45._4_4_ = -(uint)(pfVar3[1] != 0.0);
                auVar45._0_4_ = -(uint)(*pfVar3 != 0.0);
                auVar45._8_4_ = -(uint)(pfVar3[2] != 0.0);
                auVar45._12_4_ = -(uint)(pfVar3[3] != 1.0);
                uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar45);
                if ((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                   (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                  pfVar3 = (float *)(lVar16 + -4 + lVar71);
                  auVar46._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar46._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar46._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar46._12_4_ = -(uint)(pfVar3[3] != 0.0);
                  uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar46);
                  if ((((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                       ((uVar73 & 4) == 0)) &&
                      (bVar69 = ((byte)uVar73 & 8) >> 3,
                      uVar70 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 == 0)) &&
                     ((bVar62 == 0 ||
                      ((fVar78 = *(float *)(lVar16 + 0xc + lVar71), fVar78 == 1.0 && (!NAN(fVar78)))
                      )))) {
                    fVar78 = (pAVar66->l).vx.field_0.m128[0];
                    local_188 = (pAVar66->l).vx.field_0.m128[1];
                    fVar79 = (pAVar66->l).vx.field_0.m128[2];
                    fVar123 = (pAVar66->l).vx.field_0.m128[3];
                    fVar126 = (pAVar66->l).vy.field_0.m128[0];
                    fVar109 = (pAVar66->l).vy.field_0.m128[1];
                    fVar98 = (pAVar66->l).vy.field_0.m128[2];
                    fVar119 = (pAVar66->l).vy.field_0.m128[3];
                    fVar77 = (pAVar66->l).vz.field_0.m128[0];
                    fVar95 = (pAVar66->l).vz.field_0.m128[1];
                    fVar92 = (pAVar66->l).vz.field_0.m128[2];
                    fVar105 = (pAVar66->l).vz.field_0.m128[3];
                    fVar111 = (pAVar66->p).field_0.m128[0];
                    fVar124 = (pAVar66->p).field_0.m128[1];
                    fVar125 = (pAVar66->p).field_0.m128[2];
                    fVar104 = (pAVar66->p).field_0.m128[3];
                    local_168.quaternion = bVar13;
                    goto LAB_00157237;
                  }
                }
              }
            }
            uVar70 = uVar65 & 0xffffffff;
            bVar69 = (byte)uVar70 | bVar62;
            uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
            if (bVar69 == 0) {
              fVar125 = (pAVar66->l).vx.field_0.m128[0];
              fVar127 = (pAVar66->l).vx.field_0.m128[1];
              fVar133 = (pAVar66->l).vx.field_0.m128[2];
              fVar136 = (pAVar66->l).vx.field_0.m128[3];
              fVar93 = (pAVar66->l).vy.field_0.m128[0];
              fVar94 = (pAVar66->l).vy.field_0.m128[1];
              fVar99 = (pAVar66->l).vy.field_0.m128[2];
              fVar129 = (pAVar66->l).vy.field_0.m128[3];
              fVar100 = (pAVar66->l).vz.field_0.m128[0];
              fVar101 = (pAVar66->l).vz.field_0.m128[1];
              fVar134 = (pAVar66->l).vz.field_0.m128[2];
              fVar102 = (pAVar66->l).vz.field_0.m128[3];
              fVar78 = fVar95 * fVar125 + fVar123 * fVar93 + fVar77 * fVar100;
              local_188 = fVar95 * fVar127 + fVar123 * fVar94 + fVar77 * fVar101;
              fVar79 = fVar95 * fVar133 + fVar123 * fVar99 + fVar77 * fVar134;
              fVar123 = fVar95 * fVar136 + fVar123 * fVar129 + fVar77 * fVar102;
              fVar77 = *(float *)(lVar16 + -0x20 + lVar71);
              fVar95 = *(float *)(lVar16 + -0x1c + lVar71);
              fVar119 = *(float *)(lVar16 + -0x18 + lVar71);
              fVar105 = *(float *)(lVar16 + -0x10 + lVar71);
              fVar126 = fVar77 * fVar125 + fVar95 * fVar93 + fVar119 * fVar100;
              fVar109 = fVar77 * fVar127 + fVar95 * fVar94 + fVar119 * fVar101;
              fVar98 = fVar77 * fVar133 + fVar95 * fVar99 + fVar119 * fVar134;
              fVar119 = fVar77 * fVar136 + fVar95 * fVar129 + fVar119 * fVar102;
              fVar111 = *(float *)(lVar16 + -0xc + lVar71);
              fVar124 = *(float *)(lVar16 + -8 + lVar71);
              fVar77 = fVar105 * fVar125 + fVar111 * fVar93 + fVar124 * fVar100;
              fVar95 = fVar105 * fVar127 + fVar111 * fVar94 + fVar124 * fVar101;
              fVar92 = fVar105 * fVar133 + fVar111 * fVar99 + fVar124 * fVar134;
              fVar105 = fVar105 * fVar136 + fVar111 * fVar129 + fVar124 * fVar102;
              fVar104 = *(float *)(lVar16 + lVar71);
              fVar97 = *(float *)(lVar16 + 4 + lVar71);
              fVar96 = *(float *)(lVar16 + 8 + lVar71);
              fVar111 = fVar104 * fVar125 + fVar97 * fVar93 + fVar96 * fVar100 +
                        (pAVar66->p).field_0.m128[0];
              fVar124 = fVar104 * fVar127 + fVar97 * fVar94 + fVar96 * fVar101 +
                        (pAVar66->p).field_0.m128[1];
              fVar125 = fVar104 * fVar133 + fVar97 * fVar99 + fVar96 * fVar134 +
                        (pAVar66->p).field_0.m128[2];
              fVar104 = fVar104 * fVar136 + fVar97 * fVar129 + fVar96 * fVar102 +
                        (pAVar66->p).field_0.m128[3];
            }
            else {
              uVar65 = uVar65 & 0xffffffff;
              bVar69 = (byte)uVar65 & bVar62;
              uVar70 = CONCAT71((int7)(uVar65 >> 8),bVar69);
              if (bVar69 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                std::ostream::put(-0x28);
                std::ostream::flush();
                fVar77 = (pAVar66->p).field_0.m128[3];
                fVar79 = (pAVar66->l).vx.field_0.m128[3];
                fVar95 = (pAVar66->l).vy.field_0.m128[3];
                fVar123 = (pAVar66->l).vz.field_0.m128[3];
                aVar11 = (pAVar66->l).vx.field_0.field_1;
                fVar78 = (pAVar66->l).vy.field_0.m128[0];
                fVar126 = (pAVar66->l).vy.field_0.m128[1];
                fVar109 = (pAVar66->l).vz.field_0.m128[0];
                fVar98 = (pAVar66->l).vz.field_0.m128[1];
                fVar119 = (pAVar66->l).vz.field_0.m128[2];
                fVar127 = fVar79 * fVar95 + fVar77 * fVar123;
                fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                fVar111 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 + -fVar123 * fVar123;
                fVar124 = fVar77 * fVar77 - fVar79 * fVar79;
                fVar125 = fVar95 * fVar95 + fVar124 + -fVar123 * fVar123;
                fVar136 = fVar79 * fVar123 - fVar77 * fVar95;
                fVar92 = fVar77 * fVar95 + fVar79 * fVar123;
                fVar133 = fVar95 * fVar123 + fVar77 * fVar79;
                fVar77 = fVar95 * fVar123 - fVar77 * fVar79;
                fVar104 = (pAVar66->p).field_0.m128[0];
                fVar97 = (pAVar66->p).field_0.m128[1];
                fVar96 = (pAVar66->p).field_0.m128[2];
                fVar127 = fVar127 + fVar127;
                fVar136 = fVar136 + fVar136;
                fVar105 = fVar105 + fVar105;
                fVar133 = fVar133 + fVar133;
                fVar92 = fVar92 + fVar92;
                fVar77 = fVar77 + fVar77;
                fVar79 = fVar123 * fVar123 + fVar124 + -fVar95 * fVar95;
                fVar112 = fVar111 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                fVar114 = fVar111 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                fVar116 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                fVar118 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                fVar106 = fVar105 * 1.0 + fVar125 * 0.0 + fVar133 * 0.0;
                fVar107 = fVar105 * 0.0 + fVar125 * 1.0 + fVar133 * 0.0;
                fVar108 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 1.0;
                fVar110 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 0.0;
                fVar111 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                fVar124 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                fVar125 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                fVar93 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                local_178 = aVar11.y;
                fStack_174 = aVar11.z;
                local_188 = aVar11.x;
                fVar128 = local_188 * fVar112 + fVar106 * 0.0 + fVar111 * 0.0;
                fVar130 = local_188 * fVar114 + fVar107 * 0.0 + fVar124 * 0.0;
                fVar131 = local_188 * fVar116 + fVar108 * 0.0 + fVar125 * 0.0;
                fVar132 = local_188 * fVar118 + fVar110 * 0.0 + fVar93 * 0.0;
                fVar127 = fVar78 * fVar112 + fVar126 * fVar106 + fVar111 * 0.0;
                fVar133 = fVar78 * fVar114 + fVar126 * fVar107 + fVar124 * 0.0;
                fVar136 = fVar78 * fVar116 + fVar126 * fVar108 + fVar125 * 0.0;
                fVar94 = fVar78 * fVar118 + fVar126 * fVar110 + fVar93 * 0.0;
                local_138 = fVar109 * fVar112 + fVar98 * fVar106 + fVar119 * fVar111;
                fStack_134 = fVar109 * fVar114 + fVar98 * fVar107 + fVar119 * fVar124;
                fStack_130 = fVar109 * fVar116 + fVar98 * fVar108 + fVar119 * fVar125;
                fStack_12c = fVar109 * fVar118 + fVar98 * fVar110 + fVar119 * fVar93;
                fVar77 = *(float *)(lVar16 + 0xc + lVar71);
                fVar79 = *(float *)(lVar16 + -0x24 + lVar71);
                fVar95 = *(float *)(lVar16 + -0x14 + lVar71);
                fVar123 = *(float *)(lVar16 + -4 + lVar71);
                fVar129 = fVar79 * fVar95 + fVar77 * fVar123;
                fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 + -fVar123 * fVar123;
                fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                fVar135 = fVar95 * fVar95 + fVar126 + -fVar123 * fVar123;
                fVar134 = fVar79 * fVar123 - fVar77 * fVar95;
                fVar102 = fVar77 * fVar95 + fVar79 * fVar123;
                fVar137 = fVar95 * fVar123 + fVar77 * fVar79;
                fVar92 = fVar95 * fVar123 - fVar77 * fVar79;
                pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                fVar77 = *pfVar3;
                pfVar4 = (float *)(lVar16 + -0x20 + lVar71);
                fVar79 = *pfVar4;
                fVar78 = pfVar4[1];
                fVar120 = fVar123 * fVar123 + fVar126 + -fVar95 * fVar95;
                pfVar5 = (float *)(lVar16 + -0x10 + lVar71);
                fVar95 = *pfVar5;
                fVar123 = pfVar5[1];
                fVar126 = pfVar5[2];
                fVar129 = fVar129 + fVar129;
                fVar134 = fVar134 + fVar134;
                pfVar5 = (float *)(lVar16 + lVar71);
                fVar109 = *pfVar5;
                fVar98 = pfVar5[1];
                fVar119 = pfVar5[2];
                fVar100 = fVar99 * 1.0 + fVar129 * 0.0 + fVar134 * 0.0;
                fVar101 = fVar99 * 0.0 + fVar129 * 1.0 + fVar134 * 0.0;
                fVar134 = fVar99 * 0.0 + fVar129 * 0.0 + fVar134 * 1.0;
                fVar105 = fVar105 + fVar105;
                fVar137 = fVar137 + fVar137;
                fVar102 = fVar102 + fVar102;
                fVar92 = fVar92 + fVar92;
                fVar99 = fVar105 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                fVar129 = fVar105 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                fVar105 = fVar105 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                fVar135 = fVar102 * 1.0 + fVar92 * 0.0 + fVar120 * 0.0;
                fVar137 = fVar102 * 0.0 + fVar92 * 1.0 + fVar120 * 0.0;
                fVar92 = fVar102 * 0.0 + fVar92 * 0.0 + fVar120 * 1.0;
                fVar113 = fVar77 * fVar100 + fVar99 * 0.0 + fVar135 * 0.0;
                fVar115 = fVar77 * fVar101 + fVar129 * 0.0 + fVar137 * 0.0;
                fVar117 = fVar77 * fVar134 + fVar105 * 0.0 + fVar92 * 0.0;
                fVar102 = fVar79 * fVar100 + fVar78 * fVar99 + fVar135 * 0.0;
                fVar120 = fVar79 * fVar101 + fVar78 * fVar129 + fVar137 * 0.0;
                fVar103 = fVar79 * fVar134 + fVar78 * fVar105 + fVar92 * 0.0;
                fVar121 = fVar95 * fVar100 + fVar123 * fVar99 + fVar126 * fVar135;
                fVar122 = fVar95 * fVar101 + fVar123 * fVar129 + fVar126 * fVar137;
                fVar123 = fVar95 * fVar134 + fVar123 * fVar105 + fVar126 * fVar92;
                fVar126 = fVar109 * fVar100 + fVar98 * fVar99 + fVar119 * fVar135 + pfVar3[1] + 0.0;
                fVar99 = fVar109 * fVar101 + fVar98 * fVar129 + fVar119 * fVar137 + pfVar3[2] + 0.0;
                fVar109 = fVar109 * fVar134 + fVar98 * fVar105 + fVar119 * fVar92 + pfVar4[2] + 0.0;
                fVar78 = fVar113 * fVar128 + fVar115 * fVar127 + fVar117 * local_138;
                local_188 = fVar113 * fVar130 + fVar115 * fVar133 + fVar117 * fStack_134;
                fVar79 = fVar113 * fVar131 + fVar115 * fVar136 + fVar117 * fStack_130;
                fVar77 = fVar121 * fVar128 + fVar122 * fVar127 + fVar123 * local_138;
                fVar95 = fVar121 * fVar130 + fVar122 * fVar133 + fVar123 * fStack_134;
                fVar92 = fVar121 * fVar131 + fVar122 * fVar136 + fVar123 * fStack_130;
                uVar70 = extraout_RDX_00;
                fVar105 = fVar121 * fVar132 + fVar122 * fVar94 + fVar123 * fStack_12c;
                fVar123 = fVar113 * fVar132 + fVar115 * fVar94 + fVar117 * fStack_12c;
                fVar111 = fVar126 * fVar128 + fVar99 * fVar127 + fVar109 * local_138 +
                          fVar104 * fVar112 + fVar97 * fVar106 + fVar96 * fVar111 + local_178 + 0.0;
                fVar124 = fVar126 * fVar130 + fVar99 * fVar133 + fVar109 * fStack_134 +
                          fVar104 * fVar114 + fVar97 * fVar107 + fVar96 * fVar124 + fStack_174 + 0.0
                ;
                fVar125 = fVar126 * fVar131 + fVar99 * fVar136 + fVar109 * fStack_130 +
                          fVar104 * fVar116 + fVar97 * fVar108 + fVar96 * fVar125 +
                          (pAVar66->l).vy.field_0.m128[2] + 0.0;
                fVar104 = fVar126 * fVar132 + fVar99 * fVar94 + fVar109 * fStack_12c +
                          fVar104 * fVar118 + fVar97 * fVar110 + fVar96 * fVar93 + 0.0;
                fVar126 = fVar102 * fVar128 + fVar120 * fVar127 + fVar103 * local_138;
                fVar109 = fVar102 * fVar130 + fVar120 * fVar133 + fVar103 * fStack_134;
                fVar98 = fVar102 * fVar131 + fVar120 * fVar136 + fVar103 * fStack_130;
                fVar119 = fVar102 * fVar132 + fVar120 * fVar94 + fVar103 * fStack_12c;
              }
              else {
                bVar62 = bVar13 ^ 1U | bVar62;
                if (bVar62 == 0) {
                  local_e8 = ZEXT416((uint)(pAVar66->p).field_0.m128[3]);
                  local_c8 = ZEXT416((uint)(pAVar66->l).vx.field_0.m128[3]);
                  _local_b8 = ZEXT416((uint)(pAVar66->l).vy.field_0.m128[3]);
                  local_f8 = ZEXT416((uint)(pAVar66->l).vz.field_0.m128[3]);
                  pVVar1 = &(pAVar66->l).vy;
                  local_118 = (pVVar1->field_0).m128[0];
                  fStack_114 = (pAVar66->l).vy.field_0.m128[1];
                  fStack_10c = (pAVar66->l).vy.field_0.m128[3];
                  local_d8 = (pVVar1->field_0).field_1;
                  pVVar1 = &(pAVar66->l).vz;
                  fVar95 = (pVVar1->field_0).m128[0];
                  fVar123 = (pAVar66->l).vz.field_0.m128[1];
                  fVar126 = (pAVar66->l).vz.field_0.m128[2];
                  fVar109 = (pAVar66->l).vz.field_0.m128[3];
                  local_108 = (pVVar1->field_0).field_1;
                  fVar77 = (pAVar66->l).vx.field_0.m128[0];
                  fStack_7c = (pAVar66->l).vx.field_0.m128[1];
                  pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                  fVar98 = *pfVar3;
                  fVar119 = pfVar3[1];
                  fVar92 = pfVar3[2];
                  pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
                  fVar105 = *pfVar3;
                  fVar111 = pfVar3[1];
                  fVar124 = pfVar3[2];
                  puVar6 = (undefined8 *)(lVar16 + -0x10 + lVar71);
                  local_128 = *puVar6;
                  lStack_120 = puVar6[1];
                  pfVar3 = (float *)(lVar16 + lVar71);
                  fVar125 = *pfVar3;
                  fVar104 = pfVar3[1];
                  fVar97 = pfVar3[2];
                  fVar78 = fVar98 * fVar77 + fVar119 * local_118 + fVar92 * fVar95;
                  fVar96 = fVar98 * 0.0 + fVar119 * fStack_114 + fVar92 * fVar123;
                  fVar98 = fVar98 * 0.0 + fVar119 * 0.0 + fVar92 * fVar126;
                  local_138 = fVar105 * fVar77 + fVar111 * local_118 + fVar124 * fVar95;
                  fStack_134 = fVar105 * 0.0 + fVar111 * fStack_114 + fVar124 * fVar123;
                  fStack_130 = fVar105 * 0.0 + fVar111 * 0.0 + fVar124 * fVar126;
                  fStack_12c = fVar105 * fStack_7c + fVar111 * fStack_10c + fVar124 * fVar109;
                  fStack_110 = 0.0;
                  local_88 = (ulong)(uint)fVar77;
                  fStack_80 = 0.0;
                  local_a8._0_4_ =
                       fVar125 * fVar77 + fVar104 * local_118 + fVar97 * fVar95 +
                       (pAVar66->p).field_0.m128[0];
                  local_a8._4_4_ =
                       fVar125 * 0.0 + fVar104 * fStack_114 + fVar97 * fVar123 +
                       (pAVar66->p).field_0.m128[1];
                  fStack_a0 = fVar125 * 0.0 + fVar104 * 0.0 + fVar97 * fVar126 +
                              (pAVar66->p).field_0.m128[2];
                  fStack_9c = fVar125 * fStack_7c + fVar104 * fStack_10c + fVar97 * fVar109 +
                              (pAVar66->p).field_0.m128[3];
                  if (((fVar96 != 0.0) || (NAN(fVar96))) ||
                     ((fVar98 != 0.0 ||
                      (((NAN(fVar98) || (fStack_130 != 0.0)) || (NAN(fStack_130))))))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                    std::ostream::put(-0x28);
                    std::ostream::flush();
                    uVar70 = extraout_RDX_02;
                  }
                  fVar77 = (float)local_88 * (float)local_128 +
                           local_118 * local_128._4_4_ + local_108.x * (float)lStack_120;
                  fVar95 = local_88._4_4_ * (float)local_128 +
                           fStack_114 * local_128._4_4_ + local_108.y * (float)lStack_120;
                  fVar92 = fStack_80 * (float)local_128 +
                           fStack_110 * local_128._4_4_ + local_108.z * (float)lStack_120;
                  local_168.quaternion = true;
                  fVar105 = (float)local_f8._0_4_;
                  fVar123 = (float)local_c8._0_4_;
                  fVar111 = (float)local_a8._0_4_;
                  fVar124 = (float)local_a8._4_4_;
                  fVar125 = fStack_a0;
                  fVar104 = (float)local_e8._0_4_;
                  fVar126 = local_138;
                  fVar109 = fStack_134;
                  fVar98 = local_d8.z;
                  fVar119 = (float)local_b8._0_4_;
                }
                else {
                  if (((local_188 != 0.0) || (NAN(local_188))) ||
                     ((fVar79 != 0.0 ||
                      ((NAN(fVar79) ||
                       (uVar10 = *(undefined8 *)&(pAVar66->l).vz.field_0,
                       auVar24._4_4_ = -(uint)((pAVar66->l).vy.field_0.m128[0] != 0.0),
                       auVar24._0_4_ = -(uint)((pAVar66->l).vy.field_0.m128[2] != 0.0),
                       auVar24._8_4_ = -(uint)((float)uVar10 != 0.0),
                       auVar24._12_4_ = -(uint)((float)((ulong)uVar10 >> 0x20) != 0.0),
                       uVar63 = movmskps((int)CONCAT71(uVar68,bVar62),auVar24), (char)uVar63 != '\0'
                       )))))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                    std::ostream::put(-0x28);
                    std::ostream::flush();
                    uVar70 = extraout_RDX_01;
                  }
                  pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                  pfVar4 = (float *)(lVar16 + -0x20 + lVar71);
                  pfVar5 = (float *)(lVar16 + -0x10 + lVar71);
                  fVar77 = *pfVar5;
                  fVar95 = pfVar5[1];
                  pfVar9 = (float *)(lVar16 + lVar71);
                  uVar10 = *(undefined8 *)&(pAVar66->p).field_0;
                  fVar78 = (pAVar66->l).vx.field_0.m128[0] * *pfVar3;
                  local_188 = pfVar3[1] + (float)uVar10;
                  fVar79 = pfVar3[2] + (float)((ulong)uVar10 >> 0x20);
                  fVar92 = pfVar5[2] * (pAVar66->l).vz.field_0.m128[2];
                  local_168.quaternion = true;
                  fVar105 = pfVar5[3];
                  fVar123 = pfVar3[3];
                  fVar111 = *pfVar9;
                  fVar124 = pfVar9[1];
                  fVar125 = pfVar9[2];
                  fVar104 = pfVar9[3];
                  fVar126 = *pfVar4;
                  fVar109 = pfVar4[1] * (pAVar66->l).vy.field_0.m128[1];
                  fVar98 = pfVar4[2] + (pAVar66->p).field_0.m128[2];
                  fVar119 = pfVar4[3];
                }
              }
            }
          }
          else {
            auVar21._4_4_ = -(uint)((pAVar66->l).vy.field_0.m128[0] != 0.0);
            auVar21._0_4_ = -(uint)((pAVar66->l).vx.field_0.m128[3] != 0.0);
            auVar21._8_4_ = -(uint)((pAVar66->l).vy.field_0.m128[1] != 1.0);
            auVar21._12_4_ = -(uint)((pAVar66->l).vy.field_0.m128[2] != 0.0);
            uVar73 = movmskps(uVar73,auVar21);
            if ((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
               (((uVar73 & 4) != 0 ||
                (bVar69 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69),
                bVar69 != 0)))) goto LAB_00156af2;
            auVar22._4_4_ = -(uint)((pAVar66->l).vz.field_0.m128[0] != 0.0);
            auVar22._0_4_ = -(uint)((pAVar66->l).vy.field_0.m128[3] != 0.0);
            auVar22._8_4_ = -(uint)((pAVar66->l).vz.field_0.m128[1] != 0.0);
            auVar22._12_4_ = -(uint)((pAVar66->l).vz.field_0.m128[2] != 1.0);
            uVar73 = movmskps(uVar73,auVar22);
            if (((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0)) ||
               (bVar69 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69),
               bVar69 != 0)) goto LAB_00156af2;
            auVar23._4_4_ = -(uint)((pAVar66->p).field_0.m128[0] != 0.0);
            auVar23._0_4_ = -(uint)((pAVar66->l).vz.field_0.m128[3] != 0.0);
            auVar23._8_4_ = -(uint)((pAVar66->p).field_0.m128[1] != 0.0);
            auVar23._12_4_ = -(uint)((pAVar66->p).field_0.m128[2] != 0.0);
            uVar73 = movmskps(uVar73,auVar23);
            if ((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
            goto LAB_00156af2;
            bVar69 = ((byte)uVar73 & 8) >> 3;
            uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69);
            uVar70 = (ulong)uVar73;
            if ((bVar69 != 0) ||
               ((bVar13 != false &&
                ((fVar77 = (pAVar66->p).field_0.m128[3], fVar77 != 1.0 || (NAN(fVar77)))))))
            goto LAB_00156af2;
            pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
            fVar78 = *pfVar3;
            local_188 = pfVar3[1];
            fVar79 = pfVar3[2];
            fVar123 = pfVar3[3];
            pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
            fVar126 = *pfVar3;
            fVar109 = pfVar3[1];
            fVar98 = pfVar3[2];
            fVar119 = pfVar3[3];
            pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
            fVar77 = *pfVar3;
            fVar95 = pfVar3[1];
            fVar92 = pfVar3[2];
            fVar105 = pfVar3[3];
            pfVar3 = (float *)(lVar16 + lVar71);
            fVar111 = *pfVar3;
            fVar124 = pfVar3[1];
            fVar125 = pfVar3[2];
            fVar104 = pfVar3[3];
            local_168.quaternion = (bool)bVar62;
          }
LAB_00157237:
          pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x30);
          *pfVar3 = fVar78;
          pfVar3[1] = local_188;
          pfVar3[2] = fVar79;
          pfVar3[3] = fVar123;
          pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x20);
          *pfVar3 = fVar126;
          pfVar3[1] = fVar109;
          pfVar3[2] = fVar98;
          pfVar3[3] = fVar119;
          pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x10);
          *pfVar3 = fVar77;
          pfVar3[1] = fVar95;
          pfVar3[2] = fVar92;
          pfVar3[3] = fVar105;
          pfVar3 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar71);
          *pfVar3 = fVar111;
          pfVar3[1] = fVar124;
          pfVar3[2] = fVar125;
          pfVar3[3] = fVar104;
          uVar72 = uVar72 + 1;
          lVar71 = lVar71 + 0x40;
        } while (uVar72 < (ulong)plVar64[0xf]);
      }
    }
  }
  else {
    if (plVar64[0xf] == 1) {
      fVar77 = (spaces->time_range).lower;
      fVar79 = (spaces->time_range).upper;
      fVar95 = (float)plVar64[0xd];
      fVar123 = (float)((ulong)plVar64[0xd] >> 0x20);
      uVar73 = -(uint)(fVar77 < fVar95);
      uVar75 = -(uint)(fVar79 < fVar123);
      local_168.time_range =
           (BBox1f)(CONCAT44(~uVar75 & (uint)fVar123,~uVar73 & (uint)fVar77) |
                   CONCAT44((uint)fVar79 & uVar75,(uint)fVar95 & uVar73));
      local_168.spaces.size_active = 0;
      local_168.spaces.size_alloced = 0;
      local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      if (sVar15 != 0) {
        local_168.spaces.items =
             (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar15 << 6,0x10);
        pAVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
        if (spaces->quaternion == false) {
          pAVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (ulong)*(uint *)(plVar64 + 0x12);
        }
        local_168.quaternion = SUB81(pAVar66,0);
        local_168.spaces.size_active = sVar15;
        local_168.spaces.size_alloced = sVar15;
        if ((spaces->spaces).size_active != 0) {
          lVar71 = 0x30;
          uVar72 = 0;
          uVar70 = extraout_RDX_16;
          do {
            uVar73 = (uint)uVar70;
            pAVar19 = (spaces->spaces).items;
            pfVar3 = (float *)plVar64[0x11];
            bVar13 = spaces->quaternion;
            uVar68 = (undefined7)((ulong)pAVar66 >> 8);
            uVar65 = CONCAT71(uVar68,bVar13);
            bVar62 = *(byte *)(plVar64 + 0x12);
            local_168.quaternion = false;
            fVar77 = *(float *)((long)pAVar19 + lVar71 + -0x30);
            uVar10 = *(undefined8 *)((long)pAVar19 + lVar71 + -0x2c);
            fVar79 = (float)((ulong)uVar10 >> 0x20);
            local_188 = (float)uVar10;
            if (((((fVar77 != 1.0) || (NAN(fVar77))) || (local_188 != 0.0)) ||
                ((NAN(local_188) || (fVar79 != 0.0)))) || (NAN(fVar79))) {
LAB_00159f92:
              fVar95 = (float)*(undefined8 *)pfVar3;
              fVar123 = (float)((ulong)*(undefined8 *)pfVar3 >> 0x20);
              iVar74 = -(uint)(fVar95 != 1.0);
              iVar76 = -(uint)(fVar123 != 0.0);
              auVar89._4_4_ = iVar76;
              auVar89._0_4_ = iVar74;
              auVar89._8_4_ = iVar76;
              auVar89._12_4_ = iVar76;
              auVar88._8_8_ = auVar89._8_8_;
              auVar88._4_4_ = iVar74;
              auVar88._0_4_ = iVar74;
              uVar73 = movmskpd(uVar73,auVar88);
              fVar77 = pfVar3[2];
              if (((uVar73 & 1) == 0) &&
                 (((bVar69 = (byte)uVar73 >> 1, bVar69 == 0 && (fVar77 == 0.0)) && (!NAN(fVar77)))))
              {
                auVar47._4_4_ = -(uint)(pfVar3[4] != 0.0);
                auVar47._0_4_ = -(uint)(pfVar3[3] != 0.0);
                auVar47._8_4_ = -(uint)(pfVar3[5] != 1.0);
                auVar47._12_4_ = -(uint)(pfVar3[6] != 0.0);
                uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar47);
                if ((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                   (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                  auVar48._4_4_ = -(uint)(pfVar3[8] != 0.0);
                  auVar48._0_4_ = -(uint)(pfVar3[7] != 0.0);
                  auVar48._8_4_ = -(uint)(pfVar3[9] != 0.0);
                  auVar48._12_4_ = -(uint)(pfVar3[10] != 1.0);
                  uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar48);
                  if ((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                     (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                    auVar49._4_4_ = -(uint)(pfVar3[0xc] != 0.0);
                    auVar49._0_4_ = -(uint)(pfVar3[0xb] != 0.0);
                    auVar49._8_4_ = -(uint)(pfVar3[0xd] != 0.0);
                    auVar49._12_4_ = -(uint)(pfVar3[0xe] != 0.0);
                    uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar49);
                    if ((((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                         ((uVar73 & 4) == 0)) &&
                        (bVar69 = ((byte)uVar73 & 8) >> 3,
                        uVar70 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 == 0)) &&
                       ((bVar62 == 0 || ((pfVar3[0xf] == 1.0 && (!NAN(pfVar3[0xf]))))))) {
                      pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x30);
                      fVar78 = *pfVar3;
                      local_188 = pfVar3[1];
                      fVar79 = pfVar3[2];
                      fVar123 = pfVar3[3];
                      pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x20);
                      fVar126 = *pfVar3;
                      fVar109 = pfVar3[1];
                      fVar98 = pfVar3[2];
                      fVar119 = pfVar3[3];
                      pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x10);
                      fVar77 = *pfVar3;
                      fVar95 = pfVar3[1];
                      fVar92 = pfVar3[2];
                      fVar105 = pfVar3[3];
                      pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                      fVar111 = *pfVar3;
                      fVar124 = pfVar3[1];
                      fVar125 = pfVar3[2];
                      fVar104 = pfVar3[3];
                      local_168.quaternion = bVar13;
                      goto LAB_0015a6cc;
                    }
                  }
                }
              }
              uVar70 = uVar65 & 0xffffffff;
              bVar69 = (byte)uVar70 | bVar62;
              uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
              if (bVar69 == 0) {
                pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x30);
                fVar125 = *pfVar4;
                fVar127 = pfVar4[1];
                fVar133 = pfVar4[2];
                fVar136 = pfVar4[3];
                pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x20);
                fVar93 = *pfVar4;
                fVar94 = pfVar4[1];
                fVar99 = pfVar4[2];
                fVar129 = pfVar4[3];
                pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x10);
                fVar100 = *pfVar4;
                fVar101 = pfVar4[1];
                fVar134 = pfVar4[2];
                fVar102 = pfVar4[3];
                fVar78 = fVar95 * fVar125 + fVar123 * fVar93 + fVar77 * fVar100;
                local_188 = fVar95 * fVar127 + fVar123 * fVar94 + fVar77 * fVar101;
                fVar79 = fVar95 * fVar133 + fVar123 * fVar99 + fVar77 * fVar134;
                fVar123 = fVar95 * fVar136 + fVar123 * fVar129 + fVar77 * fVar102;
                fVar77 = pfVar3[4];
                fVar95 = pfVar3[5];
                fVar119 = pfVar3[6];
                fVar105 = pfVar3[8];
                fVar126 = fVar77 * fVar125 + fVar95 * fVar93 + fVar119 * fVar100;
                fVar109 = fVar77 * fVar127 + fVar95 * fVar94 + fVar119 * fVar101;
                fVar98 = fVar77 * fVar133 + fVar95 * fVar99 + fVar119 * fVar134;
                fVar119 = fVar77 * fVar136 + fVar95 * fVar129 + fVar119 * fVar102;
                fVar111 = pfVar3[9];
                fVar124 = pfVar3[10];
                fVar77 = fVar105 * fVar125 + fVar111 * fVar93 + fVar124 * fVar100;
                fVar95 = fVar105 * fVar127 + fVar111 * fVar94 + fVar124 * fVar101;
                fVar92 = fVar105 * fVar133 + fVar111 * fVar99 + fVar124 * fVar134;
                fVar105 = fVar105 * fVar136 + fVar111 * fVar129 + fVar124 * fVar102;
                fVar104 = pfVar3[0xc];
                fVar97 = pfVar3[0xd];
                fVar96 = pfVar3[0xe];
                pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                fVar111 = fVar104 * fVar125 + fVar97 * fVar93 + fVar96 * fVar100 + *pfVar3;
                fVar124 = fVar104 * fVar127 + fVar97 * fVar94 + fVar96 * fVar101 + pfVar3[1];
                fVar125 = fVar104 * fVar133 + fVar97 * fVar99 + fVar96 * fVar134 + pfVar3[2];
                fVar104 = fVar104 * fVar136 + fVar97 * fVar129 + fVar96 * fVar102 + pfVar3[3];
              }
              else {
                uVar65 = uVar65 & 0xffffffff;
                bVar69 = (byte)uVar65 & bVar62;
                uVar70 = CONCAT71((int7)(uVar65 >> 8),bVar69);
                if (bVar69 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                             ,0x67);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                  std::ostream::put(-0x28);
                  std::ostream::flush();
                  fVar77 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 0xc);
                  fVar79 = *(float *)((long)pAVar19 + lVar71 + -0x24);
                  fVar95 = *(float *)((long)pAVar19 + lVar71 + -0x14);
                  fVar123 = *(float *)((long)pAVar19 + lVar71 + -4);
                  auVar12 = *(undefined1 (*) [16])((long)pAVar19 + lVar71 + -0x30);
                  pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x20);
                  fVar78 = *pfVar4;
                  fVar126 = pfVar4[1];
                  pfVar5 = (float *)((long)pAVar19 + lVar71 + -0x10);
                  fVar109 = *pfVar5;
                  fVar98 = pfVar5[1];
                  fVar119 = pfVar5[2];
                  fVar127 = fVar79 * fVar95 + fVar77 * fVar123;
                  fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                  fVar111 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 +
                            -fVar123 * fVar123;
                  fVar124 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar125 = fVar95 * fVar95 + fVar124 + -fVar123 * fVar123;
                  fVar136 = fVar79 * fVar123 - fVar77 * fVar95;
                  fVar92 = fVar77 * fVar95 + fVar79 * fVar123;
                  fVar133 = fVar95 * fVar123 + fVar77 * fVar79;
                  fVar77 = fVar95 * fVar123 - fVar77 * fVar79;
                  pfVar5 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                  fVar104 = *pfVar5;
                  fVar97 = pfVar5[1];
                  fVar96 = pfVar5[2];
                  fVar127 = fVar127 + fVar127;
                  fVar136 = fVar136 + fVar136;
                  fVar105 = fVar105 + fVar105;
                  fVar133 = fVar133 + fVar133;
                  fVar92 = fVar92 + fVar92;
                  fVar77 = fVar77 + fVar77;
                  fVar79 = fVar123 * fVar123 + fVar124 + -fVar95 * fVar95;
                  fVar112 = fVar111 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar114 = fVar111 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                  fVar116 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                  fVar118 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar106 = fVar105 * 1.0 + fVar125 * 0.0 + fVar133 * 0.0;
                  fVar107 = fVar105 * 0.0 + fVar125 * 1.0 + fVar133 * 0.0;
                  fVar108 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 1.0;
                  fVar110 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 0.0;
                  fVar111 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  fVar124 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                  fVar125 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                  fVar93 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  local_178 = auVar12._4_4_;
                  fStack_174 = auVar12._8_4_;
                  local_188 = auVar12._0_4_;
                  fVar128 = local_188 * fVar112 + fVar106 * 0.0 + fVar111 * 0.0;
                  fVar130 = local_188 * fVar114 + fVar107 * 0.0 + fVar124 * 0.0;
                  fVar131 = local_188 * fVar116 + fVar108 * 0.0 + fVar125 * 0.0;
                  fVar132 = local_188 * fVar118 + fVar110 * 0.0 + fVar93 * 0.0;
                  fVar127 = fVar78 * fVar112 + fVar126 * fVar106 + fVar111 * 0.0;
                  fVar133 = fVar78 * fVar114 + fVar126 * fVar107 + fVar124 * 0.0;
                  fVar136 = fVar78 * fVar116 + fVar126 * fVar108 + fVar125 * 0.0;
                  fVar94 = fVar78 * fVar118 + fVar126 * fVar110 + fVar93 * 0.0;
                  local_138 = fVar109 * fVar112 + fVar98 * fVar106 + fVar119 * fVar111;
                  fStack_134 = fVar109 * fVar114 + fVar98 * fVar107 + fVar119 * fVar124;
                  fStack_130 = fVar109 * fVar116 + fVar98 * fVar108 + fVar119 * fVar125;
                  fStack_12c = fVar109 * fVar118 + fVar98 * fVar110 + fVar119 * fVar93;
                  fVar77 = pfVar3[0xf];
                  fVar79 = pfVar3[3];
                  fVar95 = pfVar3[7];
                  fVar123 = pfVar3[0xb];
                  fVar129 = fVar79 * fVar95 + fVar77 * fVar123;
                  fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                  fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 + -fVar123 * fVar123
                  ;
                  fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar135 = fVar95 * fVar95 + fVar126 + -fVar123 * fVar123;
                  fVar134 = fVar79 * fVar123 - fVar77 * fVar95;
                  fVar102 = fVar77 * fVar95 + fVar79 * fVar123;
                  fVar137 = fVar95 * fVar123 + fVar77 * fVar79;
                  fVar92 = fVar95 * fVar123 - fVar77 * fVar79;
                  fVar77 = *pfVar3;
                  fVar79 = pfVar3[4];
                  fVar78 = pfVar3[5];
                  fVar120 = fVar123 * fVar123 + fVar126 + -fVar95 * fVar95;
                  fVar95 = pfVar3[8];
                  fVar123 = pfVar3[9];
                  fVar126 = pfVar3[10];
                  fVar129 = fVar129 + fVar129;
                  fVar134 = fVar134 + fVar134;
                  fVar109 = pfVar3[0xc];
                  fVar98 = pfVar3[0xd];
                  fVar119 = pfVar3[0xe];
                  fVar100 = fVar99 * 1.0 + fVar129 * 0.0 + fVar134 * 0.0;
                  fVar101 = fVar99 * 0.0 + fVar129 * 1.0 + fVar134 * 0.0;
                  fVar134 = fVar99 * 0.0 + fVar129 * 0.0 + fVar134 * 1.0;
                  fVar105 = fVar105 + fVar105;
                  fVar137 = fVar137 + fVar137;
                  fVar102 = fVar102 + fVar102;
                  fVar92 = fVar92 + fVar92;
                  fVar99 = fVar105 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                  fVar129 = fVar105 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                  fVar105 = fVar105 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                  fVar135 = fVar102 * 1.0 + fVar92 * 0.0 + fVar120 * 0.0;
                  fVar137 = fVar102 * 0.0 + fVar92 * 1.0 + fVar120 * 0.0;
                  fVar92 = fVar102 * 0.0 + fVar92 * 0.0 + fVar120 * 1.0;
                  fVar113 = fVar77 * fVar100 + fVar99 * 0.0 + fVar135 * 0.0;
                  fVar115 = fVar77 * fVar101 + fVar129 * 0.0 + fVar137 * 0.0;
                  fVar117 = fVar77 * fVar134 + fVar105 * 0.0 + fVar92 * 0.0;
                  fVar102 = fVar79 * fVar100 + fVar78 * fVar99 + fVar135 * 0.0;
                  fVar120 = fVar79 * fVar101 + fVar78 * fVar129 + fVar137 * 0.0;
                  fVar103 = fVar79 * fVar134 + fVar78 * fVar105 + fVar92 * 0.0;
                  fVar121 = fVar95 * fVar100 + fVar123 * fVar99 + fVar126 * fVar135;
                  fVar122 = fVar95 * fVar101 + fVar123 * fVar129 + fVar126 * fVar137;
                  fVar123 = fVar95 * fVar134 + fVar123 * fVar105 + fVar126 * fVar92;
                  fVar126 = fVar109 * fVar100 + fVar98 * fVar99 + fVar119 * fVar135 +
                            pfVar3[1] + 0.0;
                  fVar99 = fVar109 * fVar101 + fVar98 * fVar129 + fVar119 * fVar137 +
                           pfVar3[2] + 0.0;
                  fVar109 = fVar109 * fVar134 + fVar98 * fVar105 + fVar119 * fVar92 +
                            pfVar3[6] + 0.0;
                  fVar78 = fVar113 * fVar128 + fVar115 * fVar127 + fVar117 * local_138;
                  local_188 = fVar113 * fVar130 + fVar115 * fVar133 + fVar117 * fStack_134;
                  fVar79 = fVar113 * fVar131 + fVar115 * fVar136 + fVar117 * fStack_130;
                  fVar77 = fVar121 * fVar128 + fVar122 * fVar127 + fVar123 * local_138;
                  fVar95 = fVar121 * fVar130 + fVar122 * fVar133 + fVar123 * fStack_134;
                  fVar92 = fVar121 * fVar131 + fVar122 * fVar136 + fVar123 * fStack_130;
                  uVar70 = extraout_RDX_17;
                  fVar105 = fVar121 * fVar132 + fVar122 * fVar94 + fVar123 * fStack_12c;
                  fVar123 = fVar113 * fVar132 + fVar115 * fVar94 + fVar117 * fStack_12c;
                  fVar111 = fVar126 * fVar128 + fVar99 * fVar127 + fVar109 * local_138 +
                            fVar104 * fVar112 + fVar97 * fVar106 + fVar96 * fVar111 +
                            local_178 + 0.0;
                  fVar124 = fVar126 * fVar130 + fVar99 * fVar133 + fVar109 * fStack_134 +
                            fVar104 * fVar114 + fVar97 * fVar107 + fVar96 * fVar124 +
                            fStack_174 + 0.0;
                  fVar125 = fVar126 * fVar131 + fVar99 * fVar136 + fVar109 * fStack_130 +
                            fVar104 * fVar116 + fVar97 * fVar108 + fVar96 * fVar125 +
                            pfVar4[2] + 0.0;
                  fVar104 = fVar126 * fVar132 + fVar99 * fVar94 + fVar109 * fStack_12c +
                            fVar104 * fVar118 + fVar97 * fVar110 + fVar96 * fVar93 + 0.0;
                  fVar126 = fVar102 * fVar128 + fVar120 * fVar127 + fVar103 * local_138;
                  fVar109 = fVar102 * fVar130 + fVar120 * fVar133 + fVar103 * fStack_134;
                  fVar98 = fVar102 * fVar131 + fVar120 * fVar136 + fVar103 * fStack_130;
                  fVar119 = fVar102 * fVar132 + fVar120 * fVar94 + fVar103 * fStack_12c;
                }
                else {
                  bVar62 = bVar13 ^ 1U | bVar62;
                  if (bVar62 == 0) {
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 0xc));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar19 + lVar71 + -0x24));
                    _local_b8 = ZEXT416(*(uint *)((long)pAVar19 + lVar71 + -0x14));
                    local_f8 = ZEXT416(*(uint *)((long)pAVar19 + lVar71 + -4));
                    paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                              *)((long)pAVar19 + lVar71 + -0x20);
                    local_118 = paVar8->x;
                    fStack_114 = paVar8->y;
                    fStack_10c = (paVar8->field_3).w;
                    local_d8 = *paVar8;
                    paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                              *)((long)pAVar19 + lVar71 + -0x10);
                    fVar95 = paVar8->x;
                    fVar123 = paVar8->y;
                    fVar126 = paVar8->z;
                    local_108 = *paVar8;
                    pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x30);
                    fVar77 = *pfVar4;
                    fStack_7c = pfVar4[1];
                    fVar109 = *pfVar3;
                    fVar98 = pfVar3[1];
                    fVar119 = pfVar3[2];
                    fVar92 = pfVar3[4];
                    fVar105 = pfVar3[5];
                    fVar111 = pfVar3[6];
                    local_128 = *(undefined8 *)(pfVar3 + 8);
                    lStack_120 = *(long *)(pfVar3 + 10);
                    fVar124 = pfVar3[0xc];
                    fVar125 = pfVar3[0xd];
                    fVar104 = pfVar3[0xe];
                    fVar78 = fVar109 * fVar77 + fVar98 * local_118 + fVar119 * fVar95;
                    fVar97 = fVar109 * 0.0 + fVar98 * fStack_114 + fVar119 * fVar123;
                    fVar109 = fVar109 * 0.0 + fVar98 * 0.0 + fVar119 * fVar126;
                    local_138 = fVar92 * fVar77 + fVar105 * local_118 + fVar111 * fVar95;
                    fStack_134 = fVar92 * 0.0 + fVar105 * fStack_114 + fVar111 * fVar123;
                    fStack_130 = fVar92 * 0.0 + fVar105 * 0.0 + fVar111 * fVar126;
                    fStack_12c = fVar92 * fStack_7c +
                                 fVar105 * fStack_10c + fVar111 * (paVar8->field_3).w;
                    fStack_110 = 0.0;
                    local_88 = (ulong)(uint)fVar77;
                    fStack_80 = 0.0;
                    pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                    local_a8._0_4_ =
                         fVar124 * fVar77 + fVar125 * local_118 + fVar104 * fVar95 + *pfVar3;
                    local_a8._4_4_ =
                         fVar124 * 0.0 + fVar125 * fStack_114 + fVar104 * fVar123 + pfVar3[1];
                    fStack_a0 = fVar124 * 0.0 + fVar125 * 0.0 + fVar104 * fVar126 + pfVar3[2];
                    fStack_9c = fVar124 * fStack_7c +
                                fVar125 * fStack_10c + fVar104 * (paVar8->field_3).w + pfVar3[3];
                    if (((fVar97 != 0.0) || (NAN(fVar97))) ||
                       ((fVar109 != 0.0 ||
                        (((NAN(fVar109) || (fStack_130 != 0.0)) || (NAN(fStack_130))))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                 ,0x61);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                      std::ostream::put(-0x28);
                      std::ostream::flush();
                      uVar70 = extraout_RDX_19;
                    }
                    fVar77 = (float)local_88 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108.x * (float)lStack_120;
                    fVar95 = local_88._4_4_ * (float)local_128 +
                             fStack_114 * local_128._4_4_ + local_108.y * (float)lStack_120;
                    fVar92 = fStack_80 * (float)local_128 +
                             fStack_110 * local_128._4_4_ + local_108.z * (float)lStack_120;
                    local_168.quaternion = true;
                    fVar105 = (float)local_f8._0_4_;
                    fVar123 = (float)local_c8._0_4_;
                    fVar111 = (float)local_a8._0_4_;
                    fVar124 = (float)local_a8._4_4_;
                    fVar125 = fStack_a0;
                    fVar104 = (float)local_e8._0_4_;
                    fVar126 = local_138;
                    fVar109 = fStack_134;
                    fVar98 = local_d8.z;
                    fVar119 = (float)local_b8._0_4_;
                  }
                  else {
                    if (((local_188 != 0.0) || (NAN(local_188))) ||
                       ((fVar79 != 0.0 ||
                        ((NAN(fVar79) ||
                         (uVar10 = *(undefined8 *)((long)pAVar19 + lVar71 + -0x10),
                         auVar28._4_4_ = -(uint)(*(float *)((long)pAVar19 + lVar71 + -0x20) != 0.0),
                         auVar28._0_4_ = -(uint)(*(float *)((long)pAVar19 + lVar71 + -0x18) != 0.0),
                         auVar28._8_4_ = -(uint)((float)uVar10 != 0.0),
                         auVar28._12_4_ = -(uint)((float)((ulong)uVar10 >> 0x20) != 0.0),
                         uVar63 = movmskps((int)CONCAT71(uVar68,bVar62),auVar28),
                         (char)uVar63 != '\0')))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                 ,0x83);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                      std::ostream::put(-0x28);
                      std::ostream::flush();
                      uVar70 = extraout_RDX_18;
                    }
                    fVar77 = pfVar3[8];
                    fVar95 = pfVar3[9];
                    uVar10 = *(undefined8 *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                    fVar78 = *(float *)((long)pAVar19 + lVar71 + -0x30) * *pfVar3;
                    local_188 = pfVar3[1] + (float)uVar10;
                    fVar79 = pfVar3[2] + (float)((ulong)uVar10 >> 0x20);
                    fVar92 = pfVar3[10] * *(float *)((long)pAVar19 + lVar71 + -8);
                    local_168.quaternion = true;
                    fVar105 = pfVar3[0xb];
                    fVar123 = pfVar3[3];
                    fVar111 = pfVar3[0xc];
                    fVar124 = pfVar3[0xd];
                    fVar125 = pfVar3[0xe];
                    fVar104 = pfVar3[0xf];
                    fVar126 = pfVar3[4];
                    fVar109 = pfVar3[5] * *(float *)((long)pAVar19 + lVar71 + -0x1c);
                    fVar98 = pfVar3[6] + *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 8);
                    fVar119 = pfVar3[7];
                  }
                }
              }
            }
            else {
              pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x24);
              auVar25._4_4_ = -(uint)(pfVar4[1] != 0.0);
              auVar25._0_4_ = -(uint)(*pfVar4 != 0.0);
              auVar25._8_4_ = -(uint)(pfVar4[2] != 1.0);
              auVar25._12_4_ = -(uint)(pfVar4[3] != 0.0);
              uVar73 = movmskps(uVar73,auVar25);
              if ((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                 (((uVar73 & 4) != 0 ||
                  (bVar69 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69),
                  bVar69 != 0)))) goto LAB_00159f92;
              pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x14);
              auVar26._4_4_ = -(uint)(pfVar4[1] != 0.0);
              auVar26._0_4_ = -(uint)(*pfVar4 != 0.0);
              auVar26._8_4_ = -(uint)(pfVar4[2] != 0.0);
              auVar26._12_4_ = -(uint)(pfVar4[3] != 1.0);
              uVar73 = movmskps(uVar73,auVar26);
              if (((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                 || (bVar69 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69)
                    , bVar69 != 0)) goto LAB_00159f92;
              pfVar4 = (float *)((long)pAVar19 + lVar71 + -4);
              auVar27._4_4_ = -(uint)(pfVar4[1] != 0.0);
              auVar27._0_4_ = -(uint)(*pfVar4 != 0.0);
              auVar27._8_4_ = -(uint)(pfVar4[2] != 0.0);
              auVar27._12_4_ = -(uint)(pfVar4[3] != 0.0);
              uVar73 = movmskps(uVar73,auVar27);
              if ((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
              goto LAB_00159f92;
              bVar69 = ((byte)uVar73 & 8) >> 3;
              uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69);
              uVar70 = (ulong)uVar73;
              if ((bVar69 != 0) ||
                 ((bVar13 != false &&
                  ((fVar77 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 0xc),
                   fVar77 != 1.0 || (NAN(fVar77))))))) goto LAB_00159f92;
              fVar78 = *pfVar3;
              local_188 = pfVar3[1];
              fVar79 = pfVar3[2];
              fVar123 = pfVar3[3];
              fVar126 = pfVar3[4];
              fVar109 = pfVar3[5];
              fVar98 = pfVar3[6];
              fVar119 = pfVar3[7];
              fVar77 = pfVar3[8];
              fVar95 = pfVar3[9];
              fVar92 = pfVar3[10];
              fVar105 = pfVar3[0xb];
              fVar111 = pfVar3[0xc];
              fVar124 = pfVar3[0xd];
              fVar125 = pfVar3[0xe];
              fVar104 = pfVar3[0xf];
              local_168.quaternion = (bool)bVar62;
            }
LAB_0015a6cc:
            pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x30);
            *pfVar3 = fVar78;
            pfVar3[1] = local_188;
            pfVar3[2] = fVar79;
            pfVar3[3] = fVar123;
            pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x20);
            *pfVar3 = fVar126;
            pfVar3[1] = fVar109;
            pfVar3[2] = fVar98;
            pfVar3[3] = fVar119;
            pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x10);
            *pfVar3 = fVar77;
            pfVar3[1] = fVar95;
            pfVar3[2] = fVar92;
            pfVar3[3] = fVar105;
            pfVar3 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar71);
            *pfVar3 = fVar111;
            pfVar3[1] = fVar124;
            pfVar3[2] = fVar125;
            pfVar3[3] = fVar104;
            uVar72 = uVar72 + 1;
            lVar71 = lVar71 + 0x40;
            pAVar66 = local_168.spaces.items;
          } while (uVar72 < (spaces->spaces).size_active);
        }
        goto LAB_0015b803;
      }
    }
    else {
      if (sVar15 != plVar64[0xf]) {
        prVar67 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar67,"number of transformations does not match");
        __cxa_throw(prVar67,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fVar77 = (spaces->time_range).lower;
      fVar79 = (spaces->time_range).upper;
      fVar95 = (float)plVar64[0xd];
      fVar123 = (float)((ulong)plVar64[0xd] >> 0x20);
      uVar73 = -(uint)(fVar77 < fVar95);
      uVar75 = -(uint)(fVar79 < fVar123);
      local_168.time_range =
           (BBox1f)(CONCAT44(~uVar75 & (uint)fVar123,~uVar73 & (uint)fVar77) |
                   CONCAT44((uint)fVar79 & uVar75,(uint)fVar95 & uVar73));
      local_168.spaces.size_active = 0;
      local_168.spaces.size_alloced = 0;
      local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      if (sVar15 != 0) {
        local_168.spaces.items =
             (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)alignedMalloc(sVar15 << 6,0x10);
        pAVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x1;
        if (spaces->quaternion == false) {
          pAVar66 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                    (ulong)*(uint *)(plVar64 + 0x12);
        }
        local_168.quaternion = SUB81(pAVar66,0);
        local_168.spaces.size_active = sVar15;
        local_168.spaces.size_alloced = sVar15;
        if ((spaces->spaces).size_active != 0) {
          lVar71 = 0x30;
          uVar72 = 0;
          uVar70 = extraout_RDX_20;
          do {
            uVar73 = (uint)uVar70;
            pAVar19 = (spaces->spaces).items;
            lVar16 = plVar64[0x11];
            bVar13 = spaces->quaternion;
            uVar68 = (undefined7)((ulong)pAVar66 >> 8);
            uVar65 = CONCAT71(uVar68,bVar13);
            bVar62 = *(byte *)(plVar64 + 0x12);
            local_168.quaternion = false;
            fVar77 = *(float *)((long)pAVar19 + lVar71 + -0x30);
            uVar10 = *(undefined8 *)((long)pAVar19 + lVar71 + -0x2c);
            fVar79 = (float)((ulong)uVar10 >> 0x20);
            local_188 = (float)uVar10;
            if ((((fVar77 != 1.0) || (NAN(fVar77))) || (local_188 != 0.0)) ||
               (((NAN(local_188) || (fVar79 != 0.0)) || (NAN(fVar79))))) {
LAB_0015ac67:
              uVar10 = *(undefined8 *)(lVar16 + -0x30 + lVar71);
              fVar95 = (float)uVar10;
              fVar123 = (float)((ulong)uVar10 >> 0x20);
              iVar74 = -(uint)(fVar95 != 1.0);
              iVar76 = -(uint)(fVar123 != 0.0);
              auVar91._4_4_ = iVar76;
              auVar91._0_4_ = iVar74;
              auVar91._8_4_ = iVar76;
              auVar91._12_4_ = iVar76;
              auVar90._8_8_ = auVar91._8_8_;
              auVar90._4_4_ = iVar74;
              auVar90._0_4_ = iVar74;
              uVar73 = movmskpd(uVar73,auVar90);
              fVar77 = *(float *)(lVar16 + -0x28 + lVar71);
              if (((uVar73 & 1) == 0) &&
                 (((bVar69 = (byte)uVar73 >> 1, bVar69 == 0 && (fVar77 == 0.0)) && (!NAN(fVar77)))))
              {
                pfVar3 = (float *)(lVar16 + -0x24 + lVar71);
                auVar50._4_4_ = -(uint)(pfVar3[1] != 0.0);
                auVar50._0_4_ = -(uint)(*pfVar3 != 0.0);
                auVar50._8_4_ = -(uint)(pfVar3[2] != 1.0);
                auVar50._12_4_ = -(uint)(pfVar3[3] != 0.0);
                uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar50);
                if ((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                   (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                  pfVar3 = (float *)(lVar16 + -0x14 + lVar71);
                  auVar51._4_4_ = -(uint)(pfVar3[1] != 0.0);
                  auVar51._0_4_ = -(uint)(*pfVar3 != 0.0);
                  auVar51._8_4_ = -(uint)(pfVar3[2] != 0.0);
                  auVar51._12_4_ = -(uint)(pfVar3[3] != 1.0);
                  uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar51);
                  if ((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                     (((uVar73 & 4) == 0 && (bVar69 = ((byte)uVar73 & 8) >> 3, bVar69 == 0)))) {
                    pfVar3 = (float *)(lVar16 + -4 + lVar71);
                    auVar52._4_4_ = -(uint)(pfVar3[1] != 0.0);
                    auVar52._0_4_ = -(uint)(*pfVar3 != 0.0);
                    auVar52._8_4_ = -(uint)(pfVar3[2] != 0.0);
                    auVar52._12_4_ = -(uint)(pfVar3[3] != 0.0);
                    uVar73 = movmskps(CONCAT31((int3)(uVar73 >> 8),bVar69),auVar52);
                    if ((((((bVar62 & (byte)uVar73) == 0) && ((uVar73 & 2) == 0)) &&
                         ((uVar73 & 4) == 0)) &&
                        (bVar69 = ((byte)uVar73 & 8) >> 3,
                        uVar70 = (ulong)CONCAT31((int3)(uVar73 >> 8),bVar69), bVar69 == 0)) &&
                       ((bVar62 == 0 ||
                        ((fVar78 = *(float *)(lVar16 + 0xc + lVar71), fVar78 == 1.0 &&
                         (!NAN(fVar78))))))) {
                      pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x30);
                      fVar78 = *pfVar3;
                      local_188 = pfVar3[1];
                      fVar79 = pfVar3[2];
                      fVar123 = pfVar3[3];
                      pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x20);
                      fVar126 = *pfVar3;
                      fVar109 = pfVar3[1];
                      fVar98 = pfVar3[2];
                      fVar119 = pfVar3[3];
                      pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x10);
                      fVar77 = *pfVar3;
                      fVar95 = pfVar3[1];
                      fVar92 = pfVar3[2];
                      fVar105 = pfVar3[3];
                      pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                      fVar111 = *pfVar3;
                      fVar124 = pfVar3[1];
                      fVar125 = pfVar3[2];
                      fVar104 = pfVar3[3];
                      local_168.quaternion = bVar13;
                      goto LAB_0015b3b8;
                    }
                  }
                }
              }
              uVar70 = uVar65 & 0xffffffff;
              bVar69 = (byte)uVar70 | bVar62;
              uVar70 = CONCAT71((int7)(uVar70 >> 8),bVar69);
              if (bVar69 == 0) {
                pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x30);
                fVar125 = *pfVar3;
                fVar127 = pfVar3[1];
                fVar133 = pfVar3[2];
                fVar136 = pfVar3[3];
                pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x20);
                fVar93 = *pfVar3;
                fVar94 = pfVar3[1];
                fVar99 = pfVar3[2];
                fVar129 = pfVar3[3];
                pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x10);
                fVar100 = *pfVar3;
                fVar101 = pfVar3[1];
                fVar134 = pfVar3[2];
                fVar102 = pfVar3[3];
                fVar78 = fVar95 * fVar125 + fVar123 * fVar93 + fVar77 * fVar100;
                local_188 = fVar95 * fVar127 + fVar123 * fVar94 + fVar77 * fVar101;
                fVar79 = fVar95 * fVar133 + fVar123 * fVar99 + fVar77 * fVar134;
                fVar123 = fVar95 * fVar136 + fVar123 * fVar129 + fVar77 * fVar102;
                fVar77 = *(float *)(lVar16 + -0x20 + lVar71);
                fVar95 = *(float *)(lVar16 + -0x1c + lVar71);
                fVar119 = *(float *)(lVar16 + -0x18 + lVar71);
                fVar105 = *(float *)(lVar16 + -0x10 + lVar71);
                fVar126 = fVar77 * fVar125 + fVar95 * fVar93 + fVar119 * fVar100;
                fVar109 = fVar77 * fVar127 + fVar95 * fVar94 + fVar119 * fVar101;
                fVar98 = fVar77 * fVar133 + fVar95 * fVar99 + fVar119 * fVar134;
                fVar119 = fVar77 * fVar136 + fVar95 * fVar129 + fVar119 * fVar102;
                fVar111 = *(float *)(lVar16 + -0xc + lVar71);
                fVar124 = *(float *)(lVar16 + -8 + lVar71);
                fVar77 = fVar105 * fVar125 + fVar111 * fVar93 + fVar124 * fVar100;
                fVar95 = fVar105 * fVar127 + fVar111 * fVar94 + fVar124 * fVar101;
                fVar92 = fVar105 * fVar133 + fVar111 * fVar99 + fVar124 * fVar134;
                fVar105 = fVar105 * fVar136 + fVar111 * fVar129 + fVar124 * fVar102;
                fVar104 = *(float *)(lVar16 + lVar71);
                fVar97 = *(float *)(lVar16 + 4 + lVar71);
                fVar96 = *(float *)(lVar16 + 8 + lVar71);
                pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                fVar111 = fVar104 * fVar125 + fVar97 * fVar93 + fVar96 * fVar100 + *pfVar3;
                fVar124 = fVar104 * fVar127 + fVar97 * fVar94 + fVar96 * fVar101 + pfVar3[1];
                fVar125 = fVar104 * fVar133 + fVar97 * fVar99 + fVar96 * fVar134 + pfVar3[2];
                fVar104 = fVar104 * fVar136 + fVar97 * fVar129 + fVar96 * fVar102 + pfVar3[3];
              }
              else {
                uVar65 = uVar65 & 0xffffffff;
                bVar69 = (byte)uVar65 & bVar62;
                uVar70 = CONCAT71((int7)(uVar65 >> 8),bVar69);
                if (bVar69 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                             ,0x67);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                  std::ostream::put(-0x28);
                  std::ostream::flush();
                  fVar77 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 0xc);
                  fVar79 = *(float *)((long)pAVar19 + lVar71 + -0x24);
                  fVar95 = *(float *)((long)pAVar19 + lVar71 + -0x14);
                  fVar123 = *(float *)((long)pAVar19 + lVar71 + -4);
                  auVar12 = *(undefined1 (*) [16])((long)pAVar19 + lVar71 + -0x30);
                  pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x20);
                  fVar78 = *pfVar3;
                  fVar126 = pfVar3[1];
                  pfVar4 = (float *)((long)pAVar19 + lVar71 + -0x10);
                  fVar109 = *pfVar4;
                  fVar98 = pfVar4[1];
                  fVar119 = pfVar4[2];
                  fVar127 = fVar79 * fVar95 + fVar77 * fVar123;
                  fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                  fVar111 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 +
                            -fVar123 * fVar123;
                  fVar124 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar125 = fVar95 * fVar95 + fVar124 + -fVar123 * fVar123;
                  fVar136 = fVar79 * fVar123 - fVar77 * fVar95;
                  fVar92 = fVar77 * fVar95 + fVar79 * fVar123;
                  fVar133 = fVar95 * fVar123 + fVar77 * fVar79;
                  fVar77 = fVar95 * fVar123 - fVar77 * fVar79;
                  pfVar4 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                  fVar104 = *pfVar4;
                  fVar97 = pfVar4[1];
                  fVar96 = pfVar4[2];
                  fVar127 = fVar127 + fVar127;
                  fVar136 = fVar136 + fVar136;
                  fVar105 = fVar105 + fVar105;
                  fVar133 = fVar133 + fVar133;
                  fVar92 = fVar92 + fVar92;
                  fVar77 = fVar77 + fVar77;
                  fVar79 = fVar123 * fVar123 + fVar124 + -fVar95 * fVar95;
                  fVar112 = fVar111 * 1.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar114 = fVar111 * 0.0 + fVar127 * 1.0 + fVar136 * 0.0;
                  fVar116 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 1.0;
                  fVar118 = fVar111 * 0.0 + fVar127 * 0.0 + fVar136 * 0.0;
                  fVar106 = fVar105 * 1.0 + fVar125 * 0.0 + fVar133 * 0.0;
                  fVar107 = fVar105 * 0.0 + fVar125 * 1.0 + fVar133 * 0.0;
                  fVar108 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 1.0;
                  fVar110 = fVar105 * 0.0 + fVar125 * 0.0 + fVar133 * 0.0;
                  fVar111 = fVar92 * 1.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  fVar124 = fVar92 * 0.0 + fVar77 * 1.0 + fVar79 * 0.0;
                  fVar125 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 1.0;
                  fVar93 = fVar92 * 0.0 + fVar77 * 0.0 + fVar79 * 0.0;
                  local_178 = auVar12._4_4_;
                  fStack_174 = auVar12._8_4_;
                  local_188 = auVar12._0_4_;
                  fVar128 = local_188 * fVar112 + fVar106 * 0.0 + fVar111 * 0.0;
                  fVar130 = local_188 * fVar114 + fVar107 * 0.0 + fVar124 * 0.0;
                  fVar131 = local_188 * fVar116 + fVar108 * 0.0 + fVar125 * 0.0;
                  fVar132 = local_188 * fVar118 + fVar110 * 0.0 + fVar93 * 0.0;
                  fVar127 = fVar78 * fVar112 + fVar126 * fVar106 + fVar111 * 0.0;
                  fVar133 = fVar78 * fVar114 + fVar126 * fVar107 + fVar124 * 0.0;
                  fVar136 = fVar78 * fVar116 + fVar126 * fVar108 + fVar125 * 0.0;
                  fVar94 = fVar78 * fVar118 + fVar126 * fVar110 + fVar93 * 0.0;
                  local_138 = fVar109 * fVar112 + fVar98 * fVar106 + fVar119 * fVar111;
                  fStack_134 = fVar109 * fVar114 + fVar98 * fVar107 + fVar119 * fVar124;
                  fStack_130 = fVar109 * fVar116 + fVar98 * fVar108 + fVar119 * fVar125;
                  fStack_12c = fVar109 * fVar118 + fVar98 * fVar110 + fVar119 * fVar93;
                  fVar77 = *(float *)(lVar16 + 0xc + lVar71);
                  fVar79 = *(float *)(lVar16 + -0x24 + lVar71);
                  fVar95 = *(float *)(lVar16 + -0x14 + lVar71);
                  fVar123 = *(float *)(lVar16 + -4 + lVar71);
                  fVar129 = fVar79 * fVar95 + fVar77 * fVar123;
                  fVar105 = fVar79 * fVar95 - fVar77 * fVar123;
                  fVar99 = fVar77 * fVar77 + fVar79 * fVar79 + -fVar95 * fVar95 + -fVar123 * fVar123
                  ;
                  fVar126 = fVar77 * fVar77 - fVar79 * fVar79;
                  fVar135 = fVar95 * fVar95 + fVar126 + -fVar123 * fVar123;
                  fVar134 = fVar79 * fVar123 - fVar77 * fVar95;
                  fVar102 = fVar77 * fVar95 + fVar79 * fVar123;
                  fVar137 = fVar95 * fVar123 + fVar77 * fVar79;
                  fVar92 = fVar95 * fVar123 - fVar77 * fVar79;
                  pfVar4 = (float *)(lVar16 + -0x30 + lVar71);
                  fVar77 = *pfVar4;
                  pfVar5 = (float *)(lVar16 + -0x20 + lVar71);
                  fVar79 = *pfVar5;
                  fVar78 = pfVar5[1];
                  fVar120 = fVar123 * fVar123 + fVar126 + -fVar95 * fVar95;
                  pfVar9 = (float *)(lVar16 + -0x10 + lVar71);
                  fVar95 = *pfVar9;
                  fVar123 = pfVar9[1];
                  fVar126 = pfVar9[2];
                  fVar129 = fVar129 + fVar129;
                  fVar134 = fVar134 + fVar134;
                  pfVar9 = (float *)(lVar16 + lVar71);
                  fVar109 = *pfVar9;
                  fVar98 = pfVar9[1];
                  fVar119 = pfVar9[2];
                  fVar100 = fVar99 * 1.0 + fVar129 * 0.0 + fVar134 * 0.0;
                  fVar101 = fVar99 * 0.0 + fVar129 * 1.0 + fVar134 * 0.0;
                  fVar134 = fVar99 * 0.0 + fVar129 * 0.0 + fVar134 * 1.0;
                  fVar105 = fVar105 + fVar105;
                  fVar137 = fVar137 + fVar137;
                  fVar102 = fVar102 + fVar102;
                  fVar92 = fVar92 + fVar92;
                  fVar99 = fVar105 * 1.0 + fVar135 * 0.0 + fVar137 * 0.0;
                  fVar129 = fVar105 * 0.0 + fVar135 * 1.0 + fVar137 * 0.0;
                  fVar105 = fVar105 * 0.0 + fVar135 * 0.0 + fVar137 * 1.0;
                  fVar135 = fVar102 * 1.0 + fVar92 * 0.0 + fVar120 * 0.0;
                  fVar137 = fVar102 * 0.0 + fVar92 * 1.0 + fVar120 * 0.0;
                  fVar92 = fVar102 * 0.0 + fVar92 * 0.0 + fVar120 * 1.0;
                  fVar113 = fVar77 * fVar100 + fVar99 * 0.0 + fVar135 * 0.0;
                  fVar115 = fVar77 * fVar101 + fVar129 * 0.0 + fVar137 * 0.0;
                  fVar117 = fVar77 * fVar134 + fVar105 * 0.0 + fVar92 * 0.0;
                  fVar102 = fVar79 * fVar100 + fVar78 * fVar99 + fVar135 * 0.0;
                  fVar120 = fVar79 * fVar101 + fVar78 * fVar129 + fVar137 * 0.0;
                  fVar103 = fVar79 * fVar134 + fVar78 * fVar105 + fVar92 * 0.0;
                  fVar121 = fVar95 * fVar100 + fVar123 * fVar99 + fVar126 * fVar135;
                  fVar122 = fVar95 * fVar101 + fVar123 * fVar129 + fVar126 * fVar137;
                  fVar123 = fVar95 * fVar134 + fVar123 * fVar105 + fVar126 * fVar92;
                  fVar126 = fVar109 * fVar100 + fVar98 * fVar99 + fVar119 * fVar135 +
                            pfVar4[1] + 0.0;
                  fVar99 = fVar109 * fVar101 + fVar98 * fVar129 + fVar119 * fVar137 +
                           pfVar4[2] + 0.0;
                  fVar109 = fVar109 * fVar134 + fVar98 * fVar105 + fVar119 * fVar92 +
                            pfVar5[2] + 0.0;
                  fVar78 = fVar113 * fVar128 + fVar115 * fVar127 + fVar117 * local_138;
                  local_188 = fVar113 * fVar130 + fVar115 * fVar133 + fVar117 * fStack_134;
                  fVar79 = fVar113 * fVar131 + fVar115 * fVar136 + fVar117 * fStack_130;
                  fVar77 = fVar121 * fVar128 + fVar122 * fVar127 + fVar123 * local_138;
                  fVar95 = fVar121 * fVar130 + fVar122 * fVar133 + fVar123 * fStack_134;
                  fVar92 = fVar121 * fVar131 + fVar122 * fVar136 + fVar123 * fStack_130;
                  uVar70 = extraout_RDX_21;
                  fVar105 = fVar121 * fVar132 + fVar122 * fVar94 + fVar123 * fStack_12c;
                  fVar123 = fVar113 * fVar132 + fVar115 * fVar94 + fVar117 * fStack_12c;
                  fVar111 = fVar126 * fVar128 + fVar99 * fVar127 + fVar109 * local_138 +
                            fVar104 * fVar112 + fVar97 * fVar106 + fVar96 * fVar111 +
                            local_178 + 0.0;
                  fVar124 = fVar126 * fVar130 + fVar99 * fVar133 + fVar109 * fStack_134 +
                            fVar104 * fVar114 + fVar97 * fVar107 + fVar96 * fVar124 +
                            fStack_174 + 0.0;
                  fVar125 = fVar126 * fVar131 + fVar99 * fVar136 + fVar109 * fStack_130 +
                            fVar104 * fVar116 + fVar97 * fVar108 + fVar96 * fVar125 +
                            pfVar3[2] + 0.0;
                  fVar104 = fVar126 * fVar132 + fVar99 * fVar94 + fVar109 * fStack_12c +
                            fVar104 * fVar118 + fVar97 * fVar110 + fVar96 * fVar93 + 0.0;
                  fVar126 = fVar102 * fVar128 + fVar120 * fVar127 + fVar103 * local_138;
                  fVar109 = fVar102 * fVar130 + fVar120 * fVar133 + fVar103 * fStack_134;
                  fVar98 = fVar102 * fVar131 + fVar120 * fVar136 + fVar103 * fStack_130;
                  fVar119 = fVar102 * fVar132 + fVar120 * fVar94 + fVar103 * fStack_12c;
                }
                else {
                  bVar62 = bVar13 ^ 1U | bVar62;
                  if (bVar62 == 0) {
                    local_e8 = ZEXT416(*(uint *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 0xc));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar19 + lVar71 + -0x24));
                    _local_b8 = ZEXT416(*(uint *)((long)pAVar19 + lVar71 + -0x14));
                    local_f8 = ZEXT416(*(uint *)((long)pAVar19 + lVar71 + -4));
                    paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                              *)((long)pAVar19 + lVar71 + -0x20);
                    local_118 = paVar8->x;
                    fStack_114 = paVar8->y;
                    fStack_10c = (paVar8->field_3).w;
                    local_d8 = *paVar8;
                    paVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1
                              *)((long)pAVar19 + lVar71 + -0x10);
                    fVar95 = paVar8->x;
                    fVar123 = paVar8->y;
                    fVar126 = paVar8->z;
                    local_108 = *paVar8;
                    pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x30);
                    fVar77 = *pfVar3;
                    fStack_7c = pfVar3[1];
                    pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                    fVar109 = *pfVar3;
                    fVar98 = pfVar3[1];
                    fVar119 = pfVar3[2];
                    pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
                    fVar92 = *pfVar3;
                    fVar105 = pfVar3[1];
                    fVar111 = pfVar3[2];
                    puVar6 = (undefined8 *)(lVar16 + -0x10 + lVar71);
                    local_128 = *puVar6;
                    lStack_120 = puVar6[1];
                    pfVar3 = (float *)(lVar16 + lVar71);
                    fVar124 = *pfVar3;
                    fVar125 = pfVar3[1];
                    fVar104 = pfVar3[2];
                    fVar78 = fVar109 * fVar77 + fVar98 * local_118 + fVar119 * fVar95;
                    fVar97 = fVar109 * 0.0 + fVar98 * fStack_114 + fVar119 * fVar123;
                    fVar109 = fVar109 * 0.0 + fVar98 * 0.0 + fVar119 * fVar126;
                    local_138 = fVar92 * fVar77 + fVar105 * local_118 + fVar111 * fVar95;
                    fStack_134 = fVar92 * 0.0 + fVar105 * fStack_114 + fVar111 * fVar123;
                    fStack_130 = fVar92 * 0.0 + fVar105 * 0.0 + fVar111 * fVar126;
                    fStack_12c = fVar92 * fStack_7c +
                                 fVar105 * fStack_10c + fVar111 * (paVar8->field_3).w;
                    fStack_110 = 0.0;
                    local_88 = (ulong)(uint)fVar77;
                    fStack_80 = 0.0;
                    pfVar3 = (float *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                    local_a8._0_4_ =
                         fVar124 * fVar77 + fVar125 * local_118 + fVar104 * fVar95 + *pfVar3;
                    local_a8._4_4_ =
                         fVar124 * 0.0 + fVar125 * fStack_114 + fVar104 * fVar123 + pfVar3[1];
                    fStack_a0 = fVar124 * 0.0 + fVar125 * 0.0 + fVar104 * fVar126 + pfVar3[2];
                    fStack_9c = fVar124 * fStack_7c +
                                fVar125 * fStack_10c + fVar104 * (paVar8->field_3).w + pfVar3[3];
                    if (((fVar97 != 0.0) || (NAN(fVar97))) ||
                       ((fVar109 != 0.0 ||
                        (((NAN(fVar109) || (fStack_130 != 0.0)) || (NAN(fStack_130))))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                 ,0x61);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                      std::ostream::put(-0x28);
                      std::ostream::flush();
                      uVar70 = extraout_RDX_23;
                    }
                    fVar77 = (float)local_88 * (float)local_128 +
                             local_118 * local_128._4_4_ + local_108.x * (float)lStack_120;
                    fVar95 = local_88._4_4_ * (float)local_128 +
                             fStack_114 * local_128._4_4_ + local_108.y * (float)lStack_120;
                    fVar92 = fStack_80 * (float)local_128 +
                             fStack_110 * local_128._4_4_ + local_108.z * (float)lStack_120;
                    local_168.quaternion = true;
                    fVar105 = (float)local_f8._0_4_;
                    fVar123 = (float)local_c8._0_4_;
                    fVar111 = (float)local_a8._0_4_;
                    fVar124 = (float)local_a8._4_4_;
                    fVar125 = fStack_a0;
                    fVar104 = (float)local_e8._0_4_;
                    fVar126 = local_138;
                    fVar109 = fStack_134;
                    fVar98 = local_d8.z;
                    fVar119 = (float)local_b8._0_4_;
                  }
                  else {
                    if (((local_188 != 0.0) || (NAN(local_188))) ||
                       ((fVar79 != 0.0 ||
                        ((NAN(fVar79) ||
                         (uVar10 = *(undefined8 *)((long)pAVar19 + lVar71 + -0x10),
                         auVar32._4_4_ = -(uint)(*(float *)((long)pAVar19 + lVar71 + -0x20) != 0.0),
                         auVar32._0_4_ = -(uint)(*(float *)((long)pAVar19 + lVar71 + -0x18) != 0.0),
                         auVar32._8_4_ = -(uint)((float)uVar10 != 0.0),
                         auVar32._12_4_ = -(uint)((float)((ulong)uVar10 >> 0x20) != 0.0),
                         uVar63 = movmskps((int)CONCAT71(uVar68,bVar62),auVar32),
                         (char)uVar63 != '\0')))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                 ,0x83);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                      std::ostream::put(-0x28);
                      std::ostream::flush();
                      uVar70 = extraout_RDX_22;
                    }
                    pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
                    pfVar4 = (float *)(lVar16 + -0x20 + lVar71);
                    pfVar5 = (float *)(lVar16 + -0x10 + lVar71);
                    fVar77 = *pfVar5;
                    fVar95 = pfVar5[1];
                    pfVar9 = (float *)(lVar16 + lVar71);
                    uVar10 = *(undefined8 *)((long)&(pAVar19->l).vx.field_0 + lVar71);
                    fVar78 = *(float *)((long)pAVar19 + lVar71 + -0x30) * *pfVar3;
                    local_188 = pfVar3[1] + (float)uVar10;
                    fVar79 = pfVar3[2] + (float)((ulong)uVar10 >> 0x20);
                    fVar92 = pfVar5[2] * *(float *)((long)pAVar19 + lVar71 + -8);
                    local_168.quaternion = true;
                    fVar105 = pfVar5[3];
                    fVar123 = pfVar3[3];
                    fVar111 = *pfVar9;
                    fVar124 = pfVar9[1];
                    fVar125 = pfVar9[2];
                    fVar104 = pfVar9[3];
                    fVar126 = *pfVar4;
                    fVar109 = pfVar4[1] * *(float *)((long)pAVar19 + lVar71 + -0x1c);
                    fVar98 = pfVar4[2] + *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 8);
                    fVar119 = pfVar4[3];
                  }
                }
              }
            }
            else {
              pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x24);
              auVar29._4_4_ = -(uint)(pfVar3[1] != 0.0);
              auVar29._0_4_ = -(uint)(*pfVar3 != 0.0);
              auVar29._8_4_ = -(uint)(pfVar3[2] != 1.0);
              auVar29._12_4_ = -(uint)(pfVar3[3] != 0.0);
              uVar73 = movmskps(uVar73,auVar29);
              if ((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) ||
                 (((uVar73 & 4) != 0 ||
                  (bVar69 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69),
                  bVar69 != 0)))) goto LAB_0015ac67;
              pfVar3 = (float *)((long)pAVar19 + lVar71 + -0x14);
              auVar30._4_4_ = -(uint)(pfVar3[1] != 0.0);
              auVar30._0_4_ = -(uint)(*pfVar3 != 0.0);
              auVar30._8_4_ = -(uint)(pfVar3[2] != 0.0);
              auVar30._12_4_ = -(uint)(pfVar3[3] != 1.0);
              uVar73 = movmskps(uVar73,auVar30);
              if (((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
                 || (bVar69 = ((byte)uVar73 & 8) >> 3, uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69)
                    , bVar69 != 0)) goto LAB_0015ac67;
              pfVar3 = (float *)((long)pAVar19 + lVar71 + -4);
              auVar31._4_4_ = -(uint)(pfVar3[1] != 0.0);
              auVar31._0_4_ = -(uint)(*pfVar3 != 0.0);
              auVar31._8_4_ = -(uint)(pfVar3[2] != 0.0);
              auVar31._12_4_ = -(uint)(pfVar3[3] != 0.0);
              uVar73 = movmskps(uVar73,auVar31);
              if ((((bVar13 & (byte)uVar73) != 0) || ((uVar73 & 2) != 0)) || ((uVar73 & 4) != 0))
              goto LAB_0015ac67;
              bVar69 = ((byte)uVar73 & 8) >> 3;
              uVar73 = CONCAT31((int3)(uVar73 >> 8),bVar69);
              uVar70 = (ulong)uVar73;
              if ((bVar69 != 0) ||
                 ((bVar13 != false &&
                  ((fVar77 = *(float *)((long)&(pAVar19->l).vx.field_0 + lVar71 + 0xc),
                   fVar77 != 1.0 || (NAN(fVar77))))))) goto LAB_0015ac67;
              pfVar3 = (float *)(lVar16 + -0x30 + lVar71);
              fVar78 = *pfVar3;
              local_188 = pfVar3[1];
              fVar79 = pfVar3[2];
              fVar123 = pfVar3[3];
              pfVar3 = (float *)(lVar16 + -0x20 + lVar71);
              fVar126 = *pfVar3;
              fVar109 = pfVar3[1];
              fVar98 = pfVar3[2];
              fVar119 = pfVar3[3];
              pfVar3 = (float *)(lVar16 + -0x10 + lVar71);
              fVar77 = *pfVar3;
              fVar95 = pfVar3[1];
              fVar92 = pfVar3[2];
              fVar105 = pfVar3[3];
              pfVar3 = (float *)(lVar16 + lVar71);
              fVar111 = *pfVar3;
              fVar124 = pfVar3[1];
              fVar125 = pfVar3[2];
              fVar104 = pfVar3[3];
              local_168.quaternion = (bool)bVar62;
            }
LAB_0015b3b8:
            pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x30);
            *pfVar3 = fVar78;
            pfVar3[1] = local_188;
            pfVar3[2] = fVar79;
            pfVar3[3] = fVar123;
            pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x20);
            *pfVar3 = fVar126;
            pfVar3[1] = fVar109;
            pfVar3[2] = fVar98;
            pfVar3[3] = fVar119;
            pfVar3 = (float *)((long)local_168.spaces.items + lVar71 + -0x10);
            *pfVar3 = fVar77;
            pfVar3[1] = fVar95;
            pfVar3[2] = fVar92;
            pfVar3[3] = fVar105;
            pfVar3 = (float *)((long)&((local_168.spaces.items)->l).vx.field_0 + lVar71);
            *pfVar3 = fVar111;
            pfVar3[1] = fVar124;
            pfVar3[2] = fVar125;
            pfVar3[3] = fVar104;
            uVar72 = uVar72 + 1;
            lVar71 = lVar71 + 0x40;
            pAVar66 = local_168.spaces.items;
          } while (uVar72 < (spaces->spaces).size_active);
        }
        goto LAB_0015b803;
      }
    }
    local_168.spaces.items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    local_168.spaces.size_alloced = 0;
    local_168.spaces.size_active = 0;
    local_168.quaternion = true;
    if (spaces->quaternion == false) {
      local_168.quaternion = SUB41((int)plVar64[0x12],0);
    }
  }
LAB_0015b803:
  convertInstances(local_90,(vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                             *)local_98,(Ref<embree::SceneGraph::Node> *)(plVar64 + 0x13),&local_168
                  );
  alignedFree(local_168.spaces.items);
  (**(code **)(*plVar64 + 0x18))(plVar64);
  return;
}

Assistant:

void convertInstances(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (node->isClosed()) {
        //if (group.size() % 10000 == 0) std::cout << "." << std::flush;
        group.push_back(new SceneGraph::TransformNode(spaces,lookupGeometries(node)));
      }
      else if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
        convertInstances(group,xfmNode->child, spaces*xfmNode->spaces);
      }
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertInstances(group,child,spaces);
      }
    }